

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiIntersectorK<8,8>::
     occluded_t<embree::avx512::SweepCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx512::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  undefined1 auVar1 [16];
  uint uVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  float fVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  int iVar19;
  long lVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [12];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  byte bVar56;
  byte bVar57;
  byte bVar58;
  byte bVar59;
  ulong uVar60;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  byte bVar61;
  byte bVar62;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  ulong uVar63;
  byte bVar64;
  ulong uVar65;
  undefined8 unaff_R13;
  ulong uVar66;
  bool bVar67;
  uint uVar68;
  uint uVar134;
  uint uVar135;
  uint uVar137;
  uint uVar138;
  uint uVar139;
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  uint uVar136;
  uint uVar140;
  undefined1 auVar131 [32];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar132 [32];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar133 [32];
  float pp;
  float fVar141;
  float fVar142;
  float fVar159;
  float fVar160;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined4 uVar165;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar176 [16];
  undefined1 auVar180 [32];
  float fVar181;
  float fVar182;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  float fVar204;
  float fVar205;
  float fVar206;
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  float fVar207;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar213 [16];
  float fVar223;
  float fVar224;
  float fVar225;
  undefined1 auVar220 [32];
  undefined1 auVar219 [16];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 in_ZMM4 [64];
  float fVar234;
  float fVar240;
  undefined1 auVar237 [32];
  undefined1 auVar236 [16];
  undefined1 auVar238 [32];
  undefined1 auVar235 [16];
  undefined1 auVar239 [64];
  undefined1 auVar241 [32];
  undefined1 auVar244 [32];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar245 [64];
  float fVar246;
  float fVar253;
  undefined1 auVar249 [32];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  float fVar251;
  float fVar252;
  undefined1 auVar250 [64];
  undefined1 auVar254 [16];
  undefined1 auVar255 [64];
  undefined1 auVar256 [64];
  float fVar258;
  undefined1 auVar257 [64];
  undefined1 auVar259 [64];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [32];
  undefined1 auVar263 [64];
  undefined1 auVar264 [32];
  float fVar265;
  undefined1 auVar266 [32];
  undefined1 auVar267 [64];
  RTCFilterFunctionNArguments args;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  StackEntry stack [3];
  int local_b1c;
  float local_8a0;
  float fStack_89c;
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  RTCFilterFunctionNArguments local_830;
  undefined1 local_800 [32];
  undefined1 local_7e0 [16];
  undefined1 local_7d0 [16];
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_6f0 [16];
  undefined1 local_6e0 [16];
  undefined1 local_6d0 [8];
  float fStack_6c8;
  float fStack_6c4;
  undefined1 local_6c0 [16];
  undefined1 local_6b0 [16];
  undefined1 local_6a0 [16];
  ulong local_688;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  undefined1 auStack_610 [16];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_510 [16];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  RTCHitN local_480 [32];
  undefined1 local_460 [32];
  undefined4 local_440;
  undefined4 uStack_43c;
  undefined4 uStack_438;
  undefined4 uStack_434;
  undefined4 uStack_430;
  undefined4 uStack_42c;
  undefined4 uStack_428;
  undefined4 uStack_424;
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined1 local_3c0 [32];
  uint local_3a0;
  uint uStack_39c;
  uint uStack_398;
  uint uStack_394;
  uint uStack_390;
  uint uStack_38c;
  uint uStack_388;
  uint uStack_384;
  uint local_380;
  uint uStack_37c;
  uint uStack_378;
  uint uStack_374;
  uint uStack_370;
  uint uStack_36c;
  uint uStack_368;
  uint uStack_364;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  byte abStack_180 [32];
  uint auStack_160 [7];
  float fStack_144;
  ulong uStack_140;
  int aiStack_138 [66];
  undefined1 auVar151 [32];
  
  uVar60 = (ulong)(byte)prim[1];
  fVar246 = *(float *)(prim + uVar60 * 0x19 + 0x12);
  auVar13 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar13 = vinsertps_avx(auVar13,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar14 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar74 = vinsertps_avx(auVar14,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar75 = vsubps_avx(auVar13,*(undefined1 (*) [16])(prim + uVar60 * 0x19 + 6));
  fVar207 = fVar246 * auVar75._0_4_;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar60 * 4 + 6);
  auVar85 = vpmovsxbd_avx2(auVar13);
  fVar141 = fVar246 * auVar74._0_4_;
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar60 * 5 + 6);
  auVar83 = vpmovsxbd_avx2(auVar14);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar71._8_8_ = 0;
  auVar71._0_8_ = *(ulong *)(prim + uVar60 * 6 + 6);
  auVar86 = vpmovsxbd_avx2(auVar71);
  auVar72._8_8_ = 0;
  auVar72._0_8_ = *(ulong *)(prim + uVar60 * 0xb + 6);
  auVar87 = vpmovsxbd_avx2(auVar72);
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar69._8_8_ = 0;
  auVar69._0_8_ = *(ulong *)(prim + uVar60 * 0xc + 6);
  auVar88 = vpmovsxbd_avx2(auVar69);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = *(ulong *)(prim + uVar60 * 0xd + 6);
  auVar84 = vpmovsxbd_avx2(auVar1);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)(prim + uVar60 * 0x12 + 6);
  auVar89 = vpmovsxbd_avx2(auVar73);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar70._8_8_ = 0;
  auVar70._0_8_ = *(ulong *)(prim + uVar60 * 0x13 + 6);
  auVar90 = vpmovsxbd_avx2(auVar70);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar226._8_8_ = 0;
  auVar226._0_8_ = *(ulong *)(prim + uVar60 * 0x14 + 6);
  auVar92 = vpmovsxbd_avx2(auVar226);
  auVar91 = vcvtdq2ps_avx(auVar92);
  auVar103._8_4_ = 1;
  auVar103._0_8_ = 0x100000001;
  auVar103._12_4_ = 1;
  auVar103._16_4_ = 1;
  auVar103._20_4_ = 1;
  auVar103._24_4_ = 1;
  auVar103._28_4_ = 1;
  auVar101._4_4_ = fVar141;
  auVar101._0_4_ = fVar141;
  auVar101._8_4_ = fVar141;
  auVar101._12_4_ = fVar141;
  auVar101._16_4_ = fVar141;
  auVar101._20_4_ = fVar141;
  auVar101._24_4_ = fVar141;
  auVar101._28_4_ = fVar141;
  auVar82 = ZEXT1632(CONCAT412(fVar246 * auVar74._12_4_,
                               CONCAT48(fVar246 * auVar74._8_4_,
                                        CONCAT44(fVar246 * auVar74._4_4_,fVar141))));
  auVar93 = vpermps_avx2(auVar103,auVar82);
  auVar80 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar81 = vpermps_avx512vl(auVar80,auVar82);
  fVar141 = auVar81._0_4_;
  auVar239._0_4_ = fVar141 * auVar86._0_4_;
  fVar251 = auVar81._4_4_;
  auVar239._4_4_ = fVar251 * auVar86._4_4_;
  fVar252 = auVar81._8_4_;
  auVar239._8_4_ = fVar252 * auVar86._8_4_;
  fVar253 = auVar81._12_4_;
  auVar239._12_4_ = fVar253 * auVar86._12_4_;
  fVar223 = auVar81._16_4_;
  auVar239._16_4_ = fVar223 * auVar86._16_4_;
  fVar224 = auVar81._20_4_;
  auVar239._20_4_ = fVar224 * auVar86._20_4_;
  fVar225 = auVar81._24_4_;
  auVar239._28_36_ = in_ZMM4._28_36_;
  auVar239._24_4_ = fVar225 * auVar86._24_4_;
  auVar82._4_4_ = auVar84._4_4_ * fVar251;
  auVar82._0_4_ = auVar84._0_4_ * fVar141;
  auVar82._8_4_ = auVar84._8_4_ * fVar252;
  auVar82._12_4_ = auVar84._12_4_ * fVar253;
  auVar82._16_4_ = auVar84._16_4_ * fVar223;
  auVar82._20_4_ = auVar84._20_4_ * fVar224;
  auVar82._24_4_ = auVar84._24_4_ * fVar225;
  auVar82._28_4_ = auVar92._28_4_;
  auVar92._4_4_ = fVar251 * auVar91._4_4_;
  auVar92._0_4_ = fVar141 * auVar91._0_4_;
  auVar92._8_4_ = fVar252 * auVar91._8_4_;
  auVar92._12_4_ = fVar253 * auVar91._12_4_;
  auVar92._16_4_ = fVar223 * auVar91._16_4_;
  auVar92._20_4_ = fVar224 * auVar91._20_4_;
  auVar92._24_4_ = fVar225 * auVar91._24_4_;
  auVar92._28_4_ = auVar81._28_4_;
  auVar13 = vfmadd231ps_fma(auVar239._0_32_,auVar93,auVar83);
  auVar14 = vfmadd231ps_fma(auVar82,auVar93,auVar88);
  auVar71 = vfmadd231ps_fma(auVar92,auVar90,auVar93);
  auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar101,auVar85);
  auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar101,auVar87);
  auVar71 = vfmadd231ps_fma(ZEXT1632(auVar71),auVar89,auVar101);
  auVar102._4_4_ = fVar207;
  auVar102._0_4_ = fVar207;
  auVar102._8_4_ = fVar207;
  auVar102._12_4_ = fVar207;
  auVar102._16_4_ = fVar207;
  auVar102._20_4_ = fVar207;
  auVar102._24_4_ = fVar207;
  auVar102._28_4_ = fVar207;
  auVar93 = ZEXT1632(CONCAT412(fVar246 * auVar75._12_4_,
                               CONCAT48(fVar246 * auVar75._8_4_,
                                        CONCAT44(fVar246 * auVar75._4_4_,fVar207))));
  auVar92 = vpermps_avx2(auVar103,auVar93);
  auVar82 = vpermps_avx512vl(auVar80,auVar93);
  fVar246 = auVar82._0_4_;
  fVar141 = auVar82._4_4_;
  auVar93._4_4_ = fVar141 * auVar86._4_4_;
  auVar93._0_4_ = fVar246 * auVar86._0_4_;
  fVar251 = auVar82._8_4_;
  auVar93._8_4_ = fVar251 * auVar86._8_4_;
  fVar252 = auVar82._12_4_;
  auVar93._12_4_ = fVar252 * auVar86._12_4_;
  fVar253 = auVar82._16_4_;
  auVar93._16_4_ = fVar253 * auVar86._16_4_;
  fVar223 = auVar82._20_4_;
  auVar93._20_4_ = fVar223 * auVar86._20_4_;
  fVar224 = auVar82._24_4_;
  auVar93._24_4_ = fVar224 * auVar86._24_4_;
  auVar93._28_4_ = auVar86._28_4_;
  auVar97._0_4_ = fVar246 * auVar84._0_4_;
  auVar97._4_4_ = fVar141 * auVar84._4_4_;
  auVar97._8_4_ = fVar251 * auVar84._8_4_;
  auVar97._12_4_ = fVar252 * auVar84._12_4_;
  auVar97._16_4_ = fVar253 * auVar84._16_4_;
  auVar97._20_4_ = fVar223 * auVar84._20_4_;
  auVar97._24_4_ = fVar224 * auVar84._24_4_;
  auVar97._28_4_ = 0;
  auVar84._4_4_ = fVar141 * auVar91._4_4_;
  auVar84._0_4_ = fVar246 * auVar91._0_4_;
  auVar84._8_4_ = fVar251 * auVar91._8_4_;
  auVar84._12_4_ = fVar252 * auVar91._12_4_;
  auVar84._16_4_ = fVar253 * auVar91._16_4_;
  auVar84._20_4_ = fVar223 * auVar91._20_4_;
  auVar84._24_4_ = fVar224 * auVar91._24_4_;
  auVar84._28_4_ = auVar91._28_4_;
  auVar72 = vfmadd231ps_fma(auVar93,auVar92,auVar83);
  auVar69 = vfmadd231ps_fma(auVar97,auVar92,auVar88);
  auVar1 = vfmadd231ps_fma(auVar84,auVar92,auVar90);
  auVar72 = vfmadd231ps_fma(ZEXT1632(auVar72),auVar102,auVar85);
  auVar69 = vfmadd231ps_fma(ZEXT1632(auVar69),auVar102,auVar87);
  auVar1 = vfmadd231ps_fma(ZEXT1632(auVar1),auVar102,auVar89);
  auVar98._8_4_ = 0x7fffffff;
  auVar98._0_8_ = 0x7fffffff7fffffff;
  auVar98._12_4_ = 0x7fffffff;
  auVar98._16_4_ = 0x7fffffff;
  auVar98._20_4_ = 0x7fffffff;
  auVar98._24_4_ = 0x7fffffff;
  auVar98._28_4_ = 0x7fffffff;
  auVar100._8_4_ = 0x219392ef;
  auVar100._0_8_ = 0x219392ef219392ef;
  auVar100._12_4_ = 0x219392ef;
  auVar100._16_4_ = 0x219392ef;
  auVar100._20_4_ = 0x219392ef;
  auVar100._24_4_ = 0x219392ef;
  auVar100._28_4_ = 0x219392ef;
  auVar85 = vandps_avx(ZEXT1632(auVar13),auVar98);
  uVar66 = vcmpps_avx512vl(auVar85,auVar100,1);
  bVar67 = (bool)((byte)uVar66 & 1);
  auVar80._0_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar13._0_4_;
  bVar67 = (bool)((byte)(uVar66 >> 1) & 1);
  auVar80._4_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar13._4_4_;
  bVar67 = (bool)((byte)(uVar66 >> 2) & 1);
  auVar80._8_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar13._8_4_;
  bVar67 = (bool)((byte)(uVar66 >> 3) & 1);
  auVar80._12_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar13._12_4_;
  auVar80._16_4_ = (uint)((byte)(uVar66 >> 4) & 1) * 0x219392ef;
  auVar80._20_4_ = (uint)((byte)(uVar66 >> 5) & 1) * 0x219392ef;
  auVar80._24_4_ = (uint)((byte)(uVar66 >> 6) & 1) * 0x219392ef;
  auVar80._28_4_ = (uint)(byte)(uVar66 >> 7) * 0x219392ef;
  auVar85 = vandps_avx(ZEXT1632(auVar14),auVar98);
  uVar66 = vcmpps_avx512vl(auVar85,auVar100,1);
  bVar67 = (bool)((byte)uVar66 & 1);
  auVar81._0_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar14._0_4_;
  bVar67 = (bool)((byte)(uVar66 >> 1) & 1);
  auVar81._4_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar14._4_4_;
  bVar67 = (bool)((byte)(uVar66 >> 2) & 1);
  auVar81._8_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar14._8_4_;
  bVar67 = (bool)((byte)(uVar66 >> 3) & 1);
  auVar81._12_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar14._12_4_;
  auVar81._16_4_ = (uint)((byte)(uVar66 >> 4) & 1) * 0x219392ef;
  auVar81._20_4_ = (uint)((byte)(uVar66 >> 5) & 1) * 0x219392ef;
  auVar81._24_4_ = (uint)((byte)(uVar66 >> 6) & 1) * 0x219392ef;
  auVar81._28_4_ = (uint)(byte)(uVar66 >> 7) * 0x219392ef;
  auVar85 = vandps_avx(ZEXT1632(auVar71),auVar98);
  uVar66 = vcmpps_avx512vl(auVar85,auVar100,1);
  bVar67 = (bool)((byte)uVar66 & 1);
  auVar85._0_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar71._0_4_;
  bVar67 = (bool)((byte)(uVar66 >> 1) & 1);
  auVar85._4_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar71._4_4_;
  bVar67 = (bool)((byte)(uVar66 >> 2) & 1);
  auVar85._8_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar71._8_4_;
  bVar67 = (bool)((byte)(uVar66 >> 3) & 1);
  auVar85._12_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar71._12_4_;
  auVar85._16_4_ = (uint)((byte)(uVar66 >> 4) & 1) * 0x219392ef;
  auVar85._20_4_ = (uint)((byte)(uVar66 >> 5) & 1) * 0x219392ef;
  auVar85._24_4_ = (uint)((byte)(uVar66 >> 6) & 1) * 0x219392ef;
  auVar85._28_4_ = (uint)(byte)(uVar66 >> 7) * 0x219392ef;
  auVar83 = vrcp14ps_avx512vl(auVar80);
  auVar99._8_4_ = 0x3f800000;
  auVar99._0_8_ = 0x3f8000003f800000;
  auVar99._12_4_ = 0x3f800000;
  auVar99._16_4_ = 0x3f800000;
  auVar99._20_4_ = 0x3f800000;
  auVar99._24_4_ = 0x3f800000;
  auVar99._28_4_ = 0x3f800000;
  auVar13 = vfnmadd213ps_fma(auVar80,auVar83,auVar99);
  auVar13 = vfmadd132ps_fma(ZEXT1632(auVar13),auVar83,auVar83);
  auVar83 = vrcp14ps_avx512vl(auVar81);
  auVar14 = vfnmadd213ps_fma(auVar81,auVar83,auVar99);
  auVar14 = vfmadd132ps_fma(ZEXT1632(auVar14),auVar83,auVar83);
  auVar83 = vrcp14ps_avx512vl(auVar85);
  auVar71 = vfnmadd213ps_fma(auVar85,auVar83,auVar99);
  auVar71 = vfmadd132ps_fma(ZEXT1632(auVar71),auVar83,auVar83);
  auVar85 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar60 * 7 + 6));
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar85 = vsubps_avx(auVar85,ZEXT1632(auVar72));
  auVar89._4_4_ = auVar13._4_4_ * auVar85._4_4_;
  auVar89._0_4_ = auVar13._0_4_ * auVar85._0_4_;
  auVar89._8_4_ = auVar13._8_4_ * auVar85._8_4_;
  auVar89._12_4_ = auVar13._12_4_ * auVar85._12_4_;
  auVar89._16_4_ = auVar85._16_4_ * 0.0;
  auVar89._20_4_ = auVar85._20_4_ * 0.0;
  auVar89._24_4_ = auVar85._24_4_ * 0.0;
  auVar89._28_4_ = auVar85._28_4_;
  auVar85 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar60 * 9 + 6));
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar85 = vsubps_avx(auVar85,ZEXT1632(auVar72));
  auVar94._0_4_ = auVar13._0_4_ * auVar85._0_4_;
  auVar94._4_4_ = auVar13._4_4_ * auVar85._4_4_;
  auVar94._8_4_ = auVar13._8_4_ * auVar85._8_4_;
  auVar94._12_4_ = auVar13._12_4_ * auVar85._12_4_;
  auVar94._16_4_ = auVar85._16_4_ * 0.0;
  auVar94._20_4_ = auVar85._20_4_ * 0.0;
  auVar94._24_4_ = auVar85._24_4_ * 0.0;
  auVar94._28_4_ = 0;
  auVar85 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar60 * 0xe + 6));
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar85 = vsubps_avx(auVar85,ZEXT1632(auVar69));
  auVar90._4_4_ = auVar14._4_4_ * auVar85._4_4_;
  auVar90._0_4_ = auVar14._0_4_ * auVar85._0_4_;
  auVar90._8_4_ = auVar14._8_4_ * auVar85._8_4_;
  auVar90._12_4_ = auVar14._12_4_ * auVar85._12_4_;
  auVar90._16_4_ = auVar85._16_4_ * 0.0;
  auVar90._20_4_ = auVar85._20_4_ * 0.0;
  auVar90._24_4_ = auVar85._24_4_ * 0.0;
  auVar90._28_4_ = auVar85._28_4_;
  auVar84 = vpbroadcastd_avx512vl();
  auVar85 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)prim[1] * 0x10 + 6));
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar85 = vsubps_avx(auVar85,ZEXT1632(auVar69));
  auVar83 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar60 * 0x15 + 6));
  auVar96._0_4_ = auVar14._0_4_ * auVar85._0_4_;
  auVar96._4_4_ = auVar14._4_4_ * auVar85._4_4_;
  auVar96._8_4_ = auVar14._8_4_ * auVar85._8_4_;
  auVar96._12_4_ = auVar14._12_4_ * auVar85._12_4_;
  auVar96._16_4_ = auVar85._16_4_ * 0.0;
  auVar96._20_4_ = auVar85._20_4_ * 0.0;
  auVar96._24_4_ = auVar85._24_4_ * 0.0;
  auVar96._28_4_ = 0;
  auVar85 = vcvtdq2ps_avx(auVar83);
  auVar85 = vsubps_avx(auVar85,ZEXT1632(auVar1));
  auVar91._4_4_ = auVar85._4_4_ * auVar71._4_4_;
  auVar91._0_4_ = auVar85._0_4_ * auVar71._0_4_;
  auVar91._8_4_ = auVar85._8_4_ * auVar71._8_4_;
  auVar91._12_4_ = auVar85._12_4_ * auVar71._12_4_;
  auVar91._16_4_ = auVar85._16_4_ * 0.0;
  auVar91._20_4_ = auVar85._20_4_ * 0.0;
  auVar91._24_4_ = auVar85._24_4_ * 0.0;
  auVar91._28_4_ = auVar85._28_4_;
  auVar85 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar60 * 0x17 + 6));
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar85 = vsubps_avx(auVar85,ZEXT1632(auVar1));
  auVar95._0_4_ = auVar71._0_4_ * auVar85._0_4_;
  auVar95._4_4_ = auVar71._4_4_ * auVar85._4_4_;
  auVar95._8_4_ = auVar71._8_4_ * auVar85._8_4_;
  auVar95._12_4_ = auVar71._12_4_ * auVar85._12_4_;
  auVar95._16_4_ = auVar85._16_4_ * 0.0;
  auVar95._20_4_ = auVar85._20_4_ * 0.0;
  auVar95._24_4_ = auVar85._24_4_ * 0.0;
  auVar95._28_4_ = 0;
  auVar85 = vpminsd_avx2(auVar89,auVar94);
  auVar83 = vpminsd_avx2(auVar90,auVar96);
  auVar85 = vmaxps_avx(auVar85,auVar83);
  auVar83 = vpminsd_avx2(auVar91,auVar95);
  uVar165 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar86._4_4_ = uVar165;
  auVar86._0_4_ = uVar165;
  auVar86._8_4_ = uVar165;
  auVar86._12_4_ = uVar165;
  auVar86._16_4_ = uVar165;
  auVar86._20_4_ = uVar165;
  auVar86._24_4_ = uVar165;
  auVar86._28_4_ = uVar165;
  auVar83 = vmaxps_avx512vl(auVar83,auVar86);
  auVar85 = vmaxps_avx(auVar85,auVar83);
  auVar83._8_4_ = 0x3f7ffffa;
  auVar83._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar83._12_4_ = 0x3f7ffffa;
  auVar83._16_4_ = 0x3f7ffffa;
  auVar83._20_4_ = 0x3f7ffffa;
  auVar83._24_4_ = 0x3f7ffffa;
  auVar83._28_4_ = 0x3f7ffffa;
  local_300 = vmulps_avx512vl(auVar85,auVar83);
  auVar85 = vpmaxsd_avx2(auVar89,auVar94);
  auVar83 = vpmaxsd_avx2(auVar90,auVar96);
  auVar85 = vminps_avx(auVar85,auVar83);
  auVar83 = vpmaxsd_avx2(auVar91,auVar95);
  uVar165 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar87._4_4_ = uVar165;
  auVar87._0_4_ = uVar165;
  auVar87._8_4_ = uVar165;
  auVar87._12_4_ = uVar165;
  auVar87._16_4_ = uVar165;
  auVar87._20_4_ = uVar165;
  auVar87._24_4_ = uVar165;
  auVar87._28_4_ = uVar165;
  auVar83 = vminps_avx512vl(auVar83,auVar87);
  auVar85 = vminps_avx(auVar85,auVar83);
  auVar88._8_4_ = 0x3f800003;
  auVar88._0_8_ = 0x3f8000033f800003;
  auVar88._12_4_ = 0x3f800003;
  auVar88._16_4_ = 0x3f800003;
  auVar88._20_4_ = 0x3f800003;
  auVar88._24_4_ = 0x3f800003;
  auVar88._28_4_ = 0x3f800003;
  auVar85 = vmulps_avx512vl(auVar85,auVar88);
  uVar16 = vcmpps_avx512vl(local_300,auVar85,2);
  uVar18 = vpcmpgtd_avx512vl(auVar84,_DAT_01fb4ba0);
  uVar66 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),(uint)(byte)((byte)uVar16 & (byte)uVar18));
  local_500 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
LAB_01aa14ba:
  if (uVar66 == 0) {
LAB_01aa3f33:
    return uVar66 != 0;
  }
  lVar20 = 0;
  for (uVar60 = uVar66; (uVar60 & 1) == 0; uVar60 = uVar60 >> 1 | 0x8000000000000000) {
    lVar20 = lVar20 + 1;
  }
  uVar2 = *(uint *)(prim + 2);
  pGVar3 = (context->scene->geometries).items[uVar2].ptr;
  uVar60 = (ulong)*(uint *)(*(long *)&pGVar3->field_0x58 +
                           pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar20 * 4 + 6));
  p_Var4 = pGVar3[1].intersectionFilterN;
  lVar20 = *(long *)&pGVar3[1].time_range.upper;
  auVar13 = *(undefined1 (*) [16])(lVar20 + (long)p_Var4 * uVar60);
  auVar14 = *(undefined1 (*) [16])(lVar20 + (uVar60 + 1) * (long)p_Var4);
  auVar71 = *(undefined1 (*) [16])(lVar20 + (uVar60 + 2) * (long)p_Var4);
  local_688 = uVar66 - 1 & uVar66;
  auVar72 = *(undefined1 (*) [16])(lVar20 + (uVar60 + 3) * (long)p_Var4);
  if (local_688 != 0) {
    uVar63 = local_688 - 1 & local_688;
    for (uVar60 = local_688; (uVar60 & 1) == 0; uVar60 = uVar60 >> 1 | 0x8000000000000000) {
    }
    if (uVar63 != 0) {
      for (; (uVar63 & 1) == 0; uVar63 = uVar63 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar69 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar1 = vinsertps_avx(auVar69,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  uVar165 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar77._4_4_ = uVar165;
  auVar77._0_4_ = uVar165;
  auVar77._8_4_ = uVar165;
  auVar77._12_4_ = uVar165;
  local_5a0._16_4_ = uVar165;
  local_5a0._0_16_ = auVar77;
  local_5a0._20_4_ = uVar165;
  local_5a0._24_4_ = uVar165;
  local_5a0._28_4_ = uVar165;
  auVar263 = ZEXT3264(local_5a0);
  uVar165 = *(undefined4 *)(ray + k * 4 + 0xa0);
  auVar79._4_4_ = uVar165;
  auVar79._0_4_ = uVar165;
  auVar79._8_4_ = uVar165;
  auVar79._12_4_ = uVar165;
  local_5c0._16_4_ = uVar165;
  local_5c0._0_16_ = auVar79;
  local_5c0._20_4_ = uVar165;
  local_5c0._24_4_ = uVar165;
  local_5c0._28_4_ = uVar165;
  auVar69 = vunpcklps_avx(auVar77,auVar79);
  fVar246 = *(float *)(ray + k * 4 + 0xc0);
  auVar254._4_4_ = fVar246;
  auVar254._0_4_ = fVar246;
  auVar254._8_4_ = fVar246;
  auVar254._12_4_ = fVar246;
  local_5e0._16_4_ = fVar246;
  local_5e0._0_16_ = auVar254;
  local_5e0._20_4_ = fVar246;
  local_5e0._24_4_ = fVar246;
  local_5e0._28_4_ = fVar246;
  local_7d0 = vinsertps_avx(auVar69,auVar254,0x28);
  auVar255 = ZEXT1664(local_7d0);
  auVar75._0_4_ = auVar13._0_4_ + auVar14._0_4_ + auVar71._0_4_ + auVar72._0_4_;
  auVar75._4_4_ = auVar13._4_4_ + auVar14._4_4_ + auVar71._4_4_ + auVar72._4_4_;
  auVar75._8_4_ = auVar13._8_4_ + auVar14._8_4_ + auVar71._8_4_ + auVar72._8_4_;
  auVar75._12_4_ = auVar13._12_4_ + auVar14._12_4_ + auVar71._12_4_ + auVar72._12_4_;
  auVar74._8_4_ = 0x3e800000;
  auVar74._0_8_ = 0x3e8000003e800000;
  auVar74._12_4_ = 0x3e800000;
  auVar69 = vmulps_avx512vl(auVar75,auVar74);
  auVar69 = vsubps_avx(auVar69,auVar1);
  auVar69 = vdpps_avx(auVar69,local_7d0,0x7f);
  fVar141 = *(float *)(ray + k * 4 + 0x60);
  auVar257 = ZEXT464((uint)fVar141);
  local_7e0 = vdpps_avx(local_7d0,local_7d0,0x7f);
  auVar259 = ZEXT1664(local_7e0);
  auVar76._4_12_ = ZEXT812(0) << 0x20;
  auVar76._0_4_ = local_7e0._0_4_;
  auVar70 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar76);
  auVar73 = vfnmadd213ss_fma(auVar70,local_7e0,ZEXT416(0x40000000));
  local_2e0 = auVar69._0_4_ * auVar70._0_4_ * auVar73._0_4_;
  auVar78._4_4_ = local_2e0;
  auVar78._0_4_ = local_2e0;
  auVar78._8_4_ = local_2e0;
  auVar78._12_4_ = local_2e0;
  fStack_570 = local_2e0;
  _local_580 = auVar78;
  fStack_56c = local_2e0;
  fStack_568 = local_2e0;
  fStack_564 = local_2e0;
  auVar69 = vfmadd231ps_fma(auVar1,local_7d0,auVar78);
  auVar69 = vblendps_avx(auVar69,ZEXT816(0) << 0x40,8);
  auVar13 = vsubps_avx(auVar13,auVar69);
  auVar71 = vsubps_avx(auVar71,auVar69);
  auVar245 = ZEXT1664(auVar71);
  auVar14 = vsubps_avx(auVar14,auVar69);
  auVar250 = ZEXT1664(auVar14);
  auVar72 = vsubps_avx(auVar72,auVar69);
  auVar85 = vbroadcastss_avx512vl(auVar13);
  auVar105._8_4_ = 1;
  auVar105._0_8_ = 0x100000001;
  auVar105._12_4_ = 1;
  auVar105._16_4_ = 1;
  auVar105._20_4_ = 1;
  auVar105._24_4_ = 1;
  auVar105._28_4_ = 1;
  local_760 = ZEXT1632(auVar13);
  auVar83 = vpermps_avx512vl(auVar105,local_760);
  auVar106._8_4_ = 2;
  auVar106._0_8_ = 0x200000002;
  auVar106._12_4_ = 2;
  auVar106._16_4_ = 2;
  auVar106._20_4_ = 2;
  auVar106._24_4_ = 2;
  auVar106._28_4_ = 2;
  auVar86 = vpermps_avx512vl(auVar106,local_760);
  auVar107._8_4_ = 3;
  auVar107._0_8_ = 0x300000003;
  auVar107._12_4_ = 3;
  auVar107._16_4_ = 3;
  auVar107._20_4_ = 3;
  auVar107._24_4_ = 3;
  auVar107._28_4_ = 3;
  auVar87 = vpermps_avx512vl(auVar107,local_760);
  auVar88 = vbroadcastss_avx512vl(auVar14);
  local_7a0 = ZEXT1632(auVar14);
  auVar84 = vpermps_avx512vl(auVar105,local_7a0);
  auVar89 = vpermps_avx512vl(auVar106,local_7a0);
  auVar90 = vpermps_avx512vl(auVar107,local_7a0);
  auVar91 = vbroadcastss_avx512vl(auVar71);
  local_780 = ZEXT1632(auVar71);
  auVar92 = vpermps_avx512vl(auVar105,local_780);
  auVar93 = vpermps_avx512vl(auVar106,local_780);
  auVar82 = vpermps_avx512vl(auVar107,local_780);
  local_260 = vbroadcastss_avx512vl(auVar72);
  _local_7c0 = ZEXT1632(auVar72);
  local_280 = vpermps_avx2(auVar105,_local_7c0);
  local_240 = vpermps_avx512vl(auVar106,_local_7c0);
  local_2c0 = vpermps_avx2(auVar107,_local_7c0);
  auVar13 = vfmadd231ps_fma(ZEXT432((uint)(fVar246 * fVar246)),local_5c0,local_5c0);
  auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),local_5a0,local_5a0);
  local_220._0_4_ = auVar13._0_4_;
  local_220._4_4_ = local_220._0_4_;
  local_220._8_4_ = local_220._0_4_;
  local_220._12_4_ = local_220._0_4_;
  local_220._16_4_ = local_220._0_4_;
  local_220._20_4_ = local_220._0_4_;
  local_220._24_4_ = local_220._0_4_;
  local_220._28_4_ = local_220._0_4_;
  auVar104._8_4_ = 0x7fffffff;
  auVar104._0_8_ = 0x7fffffff7fffffff;
  auVar104._12_4_ = 0x7fffffff;
  auVar104._16_4_ = 0x7fffffff;
  auVar104._20_4_ = 0x7fffffff;
  auVar104._24_4_ = 0x7fffffff;
  auVar104._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_220,auVar104);
  local_6f0 = ZEXT416((uint)local_2e0);
  local_2e0 = fVar141 - local_2e0;
  fStack_2dc = local_2e0;
  fStack_2d8 = local_2e0;
  fStack_2d4 = local_2e0;
  fStack_2d0 = local_2e0;
  fStack_2cc = local_2e0;
  fStack_2c8 = local_2e0;
  fStack_2c4 = local_2e0;
  local_4a0 = vpbroadcastd_avx512vl();
  uVar60 = 0;
  bVar59 = 0;
  local_b1c = 1;
  local_4c0 = vpbroadcastd_avx512vl();
  auVar13 = vsqrtss_avx(local_7e0,local_7e0);
  auVar14 = vsqrtss_avx(local_7e0,local_7e0);
  local_510 = ZEXT816(0x3f80000000000000);
  auVar80 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar267 = ZEXT3264(auVar80);
  auVar239 = ZEXT3264(_DAT_01f7b040);
  local_2a0 = local_240;
  do {
    auVar71 = vmovshdup_avx(local_510);
    auVar71 = vsubps_avx(auVar71,local_510);
    auVar143._0_4_ = auVar71._0_4_;
    fVar15 = auVar143._0_4_ * 0.04761905;
    uVar165 = local_510._0_4_;
    auVar229._4_4_ = uVar165;
    auVar229._0_4_ = uVar165;
    auVar229._8_4_ = uVar165;
    auVar229._12_4_ = uVar165;
    auVar229._16_4_ = uVar165;
    auVar229._20_4_ = uVar165;
    auVar229._24_4_ = uVar165;
    auVar229._28_4_ = uVar165;
    auVar143._4_4_ = auVar143._0_4_;
    auVar143._8_4_ = auVar143._0_4_;
    auVar143._12_4_ = auVar143._0_4_;
    auVar151._16_4_ = auVar143._0_4_;
    auVar151._0_16_ = auVar143;
    auVar151._20_4_ = auVar143._0_4_;
    auVar151._24_4_ = auVar143._0_4_;
    auVar151._28_4_ = auVar143._0_4_;
    auVar71 = vfmadd231ps_fma(auVar229,auVar151,auVar239._0_32_);
    auVar266 = auVar267._0_32_;
    auVar81 = vsubps_avx512vl(auVar266,ZEXT1632(auVar71));
    fVar246 = auVar81._0_4_;
    fVar252 = auVar81._4_4_;
    fVar223 = auVar81._8_4_;
    fVar225 = auVar81._12_4_;
    fVar234 = auVar81._16_4_;
    fVar265 = auVar81._20_4_;
    fVar182 = auVar81._24_4_;
    fVar142 = fVar246 * fVar246 * fVar246;
    fVar159 = fVar252 * fVar252 * fVar252;
    auVar112._4_4_ = fVar159;
    auVar112._0_4_ = fVar142;
    fVar160 = fVar223 * fVar223 * fVar223;
    auVar112._8_4_ = fVar160;
    fVar161 = fVar225 * fVar225 * fVar225;
    auVar112._12_4_ = fVar161;
    fVar162 = fVar234 * fVar234 * fVar234;
    auVar112._16_4_ = fVar162;
    fVar163 = fVar265 * fVar265 * fVar265;
    auVar112._20_4_ = fVar163;
    fVar164 = fVar182 * fVar182 * fVar182;
    auVar112._24_4_ = fVar164;
    auVar112._28_4_ = auVar143._0_4_;
    auVar94 = vbroadcastss_avx512vl(ZEXT416(0x40800000));
    auVar80 = vmulps_avx512vl(auVar112,auVar94);
    fVar251 = auVar71._0_4_;
    fVar253 = auVar71._4_4_;
    fVar224 = auVar71._8_4_;
    fVar207 = auVar71._12_4_;
    fVar181 = fVar251 * fVar251 * fVar251;
    fVar204 = fVar253 * fVar253 * fVar253;
    fVar205 = fVar224 * fVar224 * fVar224;
    fVar206 = fVar207 * fVar207 * fVar207;
    auVar256._0_4_ = fVar251 * fVar246;
    auVar256._4_4_ = fVar253 * fVar252;
    auVar256._8_4_ = fVar224 * fVar223;
    auVar256._12_4_ = fVar207 * fVar225;
    auVar256._16_4_ = fVar234 * 0.0;
    auVar256._20_4_ = fVar265 * 0.0;
    auVar256._28_36_ = auVar255._28_36_;
    auVar256._24_4_ = fVar182 * 0.0;
    auVar95 = vmulps_avx512vl(ZEXT1632(CONCAT412(fVar206,CONCAT48(fVar205,CONCAT44(fVar204,fVar181))
                                                )),auVar94);
    fVar258 = auVar95._28_4_ + auVar143._0_4_;
    fVar240 = fVar258 + auVar259._28_4_ + auVar239._28_4_;
    auVar113._4_4_ = fVar159 * 0.16666667;
    auVar113._0_4_ = fVar142 * 0.16666667;
    auVar113._8_4_ = fVar160 * 0.16666667;
    auVar113._12_4_ = fVar161 * 0.16666667;
    auVar113._16_4_ = fVar162 * 0.16666667;
    auVar113._20_4_ = fVar163 * 0.16666667;
    auVar113._24_4_ = fVar164 * 0.16666667;
    auVar113._28_4_ = fVar258;
    auVar114._4_4_ =
         (auVar256._4_4_ * fVar252 * 12.0 + auVar256._4_4_ * fVar253 * 6.0 + fVar204 + auVar80._4_4_
         ) * 0.16666667;
    auVar114._0_4_ =
         (auVar256._0_4_ * fVar246 * 12.0 + auVar256._0_4_ * fVar251 * 6.0 + fVar181 + auVar80._0_4_
         ) * 0.16666667;
    auVar114._8_4_ =
         (auVar256._8_4_ * fVar223 * 12.0 + auVar256._8_4_ * fVar224 * 6.0 + fVar205 + auVar80._8_4_
         ) * 0.16666667;
    auVar114._12_4_ =
         (auVar256._12_4_ * fVar225 * 12.0 + auVar256._12_4_ * fVar207 * 6.0 +
         fVar206 + auVar80._12_4_) * 0.16666667;
    auVar114._16_4_ =
         (auVar256._16_4_ * fVar234 * 12.0 + auVar256._16_4_ * 0.0 * 6.0 + auVar80._16_4_ + 0.0) *
         0.16666667;
    auVar114._20_4_ =
         (auVar256._20_4_ * fVar265 * 12.0 + auVar256._20_4_ * 0.0 * 6.0 + auVar80._20_4_ + 0.0) *
         0.16666667;
    auVar114._24_4_ =
         (auVar256._24_4_ * fVar182 * 12.0 + auVar256._24_4_ * 0.0 * 6.0 + auVar80._24_4_ + 0.0) *
         0.16666667;
    auVar114._28_4_ = auVar259._28_4_;
    auVar115._4_4_ =
         (auVar95._4_4_ + fVar159 + auVar256._4_4_ * fVar253 * 12.0 + auVar256._4_4_ * fVar252 * 6.0
         ) * 0.16666667;
    auVar115._0_4_ =
         (auVar95._0_4_ + fVar142 + auVar256._0_4_ * fVar251 * 12.0 + auVar256._0_4_ * fVar246 * 6.0
         ) * 0.16666667;
    auVar115._8_4_ =
         (auVar95._8_4_ + fVar160 + auVar256._8_4_ * fVar224 * 12.0 + auVar256._8_4_ * fVar223 * 6.0
         ) * 0.16666667;
    auVar115._12_4_ =
         (auVar95._12_4_ + fVar161 +
         auVar256._12_4_ * fVar207 * 12.0 + auVar256._12_4_ * fVar225 * 6.0) * 0.16666667;
    auVar115._16_4_ =
         (auVar95._16_4_ + fVar162 + auVar256._16_4_ * 0.0 * 12.0 + auVar256._16_4_ * fVar234 * 6.0)
         * 0.16666667;
    auVar115._20_4_ =
         (auVar95._20_4_ + fVar163 + auVar256._20_4_ * 0.0 * 12.0 + auVar256._20_4_ * fVar265 * 6.0)
         * 0.16666667;
    auVar115._24_4_ =
         (auVar95._24_4_ + fVar164 + auVar256._24_4_ * 0.0 * 12.0 + auVar256._24_4_ * fVar182 * 6.0)
         * 0.16666667;
    auVar115._28_4_ = auVar263._28_4_;
    fVar181 = fVar181 * 0.16666667;
    fVar204 = fVar204 * 0.16666667;
    fVar205 = fVar205 * 0.16666667;
    fVar206 = fVar206 * 0.16666667;
    auVar116._28_4_ = fVar240;
    auVar116._0_28_ = ZEXT1628(CONCAT412(fVar206,CONCAT48(fVar205,CONCAT44(fVar204,fVar181))));
    auVar95 = vmulps_avx512vl(local_260,auVar116);
    auVar117._4_4_ = local_280._4_4_ * fVar204;
    auVar117._0_4_ = local_280._0_4_ * fVar181;
    auVar117._8_4_ = local_280._8_4_ * fVar205;
    auVar117._12_4_ = local_280._12_4_ * fVar206;
    auVar117._16_4_ = local_280._16_4_ * 0.0;
    auVar117._20_4_ = local_280._20_4_ * 0.0;
    auVar117._24_4_ = local_280._24_4_ * 0.0;
    auVar117._28_4_ = auVar257._28_4_ + auVar263._28_4_ + auVar80._28_4_ + 0.0;
    auVar80 = vmulps_avx512vl(local_2a0,auVar116);
    auVar118._4_4_ = local_2c0._4_4_ * fVar204;
    auVar118._0_4_ = local_2c0._0_4_ * fVar181;
    auVar118._8_4_ = local_2c0._8_4_ * fVar205;
    auVar118._12_4_ = local_2c0._12_4_ * fVar206;
    auVar118._16_4_ = local_2c0._16_4_ * 0.0;
    auVar118._20_4_ = local_2c0._20_4_ * 0.0;
    auVar118._24_4_ = local_2c0._24_4_ * 0.0;
    auVar118._28_4_ = fVar240;
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar115,auVar91);
    auVar96 = vfmadd231ps_avx512vl(auVar117,auVar115,auVar92);
    auVar80 = vfmadd231ps_avx512vl(auVar80,auVar115,auVar93);
    auVar97 = vfmadd231ps_avx512vl(auVar118,auVar82,auVar115);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar114,auVar88);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar114,auVar84);
    auVar80 = vfmadd231ps_avx512vl(auVar80,auVar114,auVar89);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar90,auVar114);
    auVar98 = vfmadd231ps_avx512vl(auVar95,auVar113,auVar85);
    auVar99 = vfmadd231ps_avx512vl(auVar96,auVar113,auVar83);
    auVar100 = vfmadd231ps_avx512vl(auVar80,auVar113,auVar86);
    auVar95 = vfmadd231ps_avx512vl(auVar97,auVar87,auVar113);
    auVar96 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar97 = vxorps_avx512vl(auVar81,auVar96);
    auVar101 = vxorps_avx512vl(ZEXT1632(auVar71),auVar96);
    auVar230._0_4_ = auVar101._0_4_ * fVar251;
    auVar230._4_4_ = auVar101._4_4_ * fVar253;
    auVar230._8_4_ = auVar101._8_4_ * fVar224;
    auVar230._12_4_ = auVar101._12_4_ * fVar207;
    auVar230._16_4_ = auVar101._16_4_ * 0.0;
    auVar230._20_4_ = auVar101._20_4_ * 0.0;
    auVar230._24_4_ = auVar101._24_4_ * 0.0;
    auVar230._28_4_ = 0;
    auVar102 = vmulps_avx512vl(auVar256._0_32_,auVar94);
    auVar80 = vsubps_avx(auVar230,auVar102);
    auVar119._4_4_ = auVar97._4_4_ * fVar252 * 0.5;
    auVar119._0_4_ = auVar97._0_4_ * fVar246 * 0.5;
    auVar119._8_4_ = auVar97._8_4_ * fVar223 * 0.5;
    auVar119._12_4_ = auVar97._12_4_ * fVar225 * 0.5;
    auVar119._16_4_ = auVar97._16_4_ * fVar234 * 0.5;
    auVar119._20_4_ = auVar97._20_4_ * fVar265 * 0.5;
    auVar119._24_4_ = auVar97._24_4_ * fVar182 * 0.5;
    auVar119._28_4_ = auVar81._28_4_;
    auVar120._4_4_ = auVar80._4_4_ * 0.5;
    auVar120._0_4_ = auVar80._0_4_ * 0.5;
    auVar120._8_4_ = auVar80._8_4_ * 0.5;
    auVar120._12_4_ = auVar80._12_4_ * 0.5;
    auVar120._16_4_ = auVar80._16_4_ * 0.5;
    auVar120._20_4_ = auVar80._20_4_ * 0.5;
    auVar120._24_4_ = auVar80._24_4_ * 0.5;
    auVar120._28_4_ = auVar80._28_4_;
    auVar123._4_4_ = (auVar102._4_4_ + fVar252 * fVar252) * 0.5;
    auVar123._0_4_ = (auVar102._0_4_ + fVar246 * fVar246) * 0.5;
    auVar123._8_4_ = (auVar102._8_4_ + fVar223 * fVar223) * 0.5;
    auVar123._12_4_ = (auVar102._12_4_ + fVar225 * fVar225) * 0.5;
    auVar123._16_4_ = (auVar102._16_4_ + fVar234 * fVar234) * 0.5;
    auVar123._20_4_ = (auVar102._20_4_ + fVar265 * fVar265) * 0.5;
    auVar123._24_4_ = (auVar102._24_4_ + fVar182 * fVar182) * 0.5;
    auVar123._28_4_ = auVar102._28_4_ + auVar245._28_4_;
    fVar246 = fVar251 * fVar251 * 0.5;
    fVar251 = fVar253 * fVar253 * 0.5;
    fVar252 = fVar224 * fVar224 * 0.5;
    fVar253 = fVar207 * fVar207 * 0.5;
    auVar124._28_4_ = auVar250._28_4_;
    auVar124._0_28_ = ZEXT1628(CONCAT412(fVar253,CONCAT48(fVar252,CONCAT44(fVar251,fVar246))));
    auVar80 = vmulps_avx512vl(local_260,auVar124);
    auVar33._4_4_ = local_280._4_4_ * fVar251;
    auVar33._0_4_ = local_280._0_4_ * fVar246;
    auVar33._8_4_ = local_280._8_4_ * fVar252;
    auVar33._12_4_ = local_280._12_4_ * fVar253;
    auVar33._16_4_ = local_280._16_4_ * 0.0;
    auVar33._20_4_ = local_280._20_4_ * 0.0;
    auVar33._24_4_ = local_280._24_4_ * 0.0;
    auVar33._28_4_ = auVar101._28_4_;
    auVar81 = vmulps_avx512vl(local_2a0,auVar124);
    auVar34._4_4_ = fVar251 * local_2c0._4_4_;
    auVar34._0_4_ = fVar246 * local_2c0._0_4_;
    auVar34._8_4_ = fVar252 * local_2c0._8_4_;
    auVar34._12_4_ = fVar253 * local_2c0._12_4_;
    auVar34._16_4_ = local_2c0._16_4_ * 0.0;
    auVar34._20_4_ = local_2c0._20_4_ * 0.0;
    auVar34._24_4_ = local_2c0._24_4_ * 0.0;
    auVar34._28_4_ = auVar250._28_4_;
    auVar80 = vfmadd231ps_avx512vl(auVar80,auVar123,auVar91);
    auVar97 = vfmadd231ps_avx512vl(auVar33,auVar123,auVar92);
    auVar81 = vfmadd231ps_avx512vl(auVar81,auVar123,auVar93);
    auVar71 = vfmadd231ps_fma(auVar34,auVar82,auVar123);
    auVar80 = vfmadd231ps_avx512vl(auVar80,auVar120,auVar88);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar120,auVar84);
    auVar81 = vfmadd231ps_avx512vl(auVar81,auVar120,auVar89);
    auVar101 = vfmadd231ps_avx512vl(ZEXT1632(auVar71),auVar90,auVar120);
    auVar80 = vfmadd231ps_avx512vl(auVar80,auVar119,auVar85);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar119,auVar83);
    auVar81 = vfmadd231ps_avx512vl(auVar81,auVar119,auVar86);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar87,auVar119);
    auVar35._4_4_ = auVar80._4_4_ * fVar15;
    auVar35._0_4_ = auVar80._0_4_ * fVar15;
    auVar35._8_4_ = auVar80._8_4_ * fVar15;
    auVar35._12_4_ = auVar80._12_4_ * fVar15;
    auVar35._16_4_ = auVar80._16_4_ * fVar15;
    auVar35._20_4_ = auVar80._20_4_ * fVar15;
    auVar35._24_4_ = auVar80._24_4_ * fVar15;
    auVar35._28_4_ = auVar82._28_4_;
    auVar263 = ZEXT3264(auVar35);
    auVar36._4_4_ = auVar97._4_4_ * fVar15;
    auVar36._0_4_ = auVar97._0_4_ * fVar15;
    auVar36._8_4_ = auVar97._8_4_ * fVar15;
    auVar36._12_4_ = auVar97._12_4_ * fVar15;
    auVar36._16_4_ = auVar97._16_4_ * fVar15;
    auVar36._20_4_ = auVar97._20_4_ * fVar15;
    auVar36._24_4_ = auVar97._24_4_ * fVar15;
    auVar36._28_4_ = 0x3e2aaaab;
    auVar37._4_4_ = auVar81._4_4_ * fVar15;
    auVar37._0_4_ = auVar81._0_4_ * fVar15;
    auVar37._8_4_ = auVar81._8_4_ * fVar15;
    auVar37._12_4_ = auVar81._12_4_ * fVar15;
    auVar37._16_4_ = auVar81._16_4_ * fVar15;
    auVar37._20_4_ = auVar81._20_4_ * fVar15;
    auVar37._24_4_ = auVar81._24_4_ * fVar15;
    auVar37._28_4_ = 0x40c00000;
    fVar246 = auVar101._0_4_ * fVar15;
    fVar251 = auVar101._4_4_ * fVar15;
    auVar38._4_4_ = fVar251;
    auVar38._0_4_ = fVar246;
    fVar252 = auVar101._8_4_ * fVar15;
    auVar38._8_4_ = fVar252;
    fVar253 = auVar101._12_4_ * fVar15;
    auVar38._12_4_ = fVar253;
    fVar223 = auVar101._16_4_ * fVar15;
    auVar38._16_4_ = fVar223;
    fVar224 = auVar101._20_4_ * fVar15;
    auVar38._20_4_ = fVar224;
    fVar225 = auVar101._24_4_ * fVar15;
    auVar38._24_4_ = fVar225;
    auVar38._28_4_ = fVar15;
    auVar71 = vxorps_avx512vl(auVar96._0_16_,auVar96._0_16_);
    auVar101 = vpermt2ps_avx512vl(auVar98,_DAT_01fb9fc0,ZEXT1632(auVar71));
    auVar255 = ZEXT3264(auVar101);
    auVar102 = vpermt2ps_avx512vl(auVar99,_DAT_01fb9fc0,ZEXT1632(auVar71));
    auVar257 = ZEXT3264(auVar102);
    auVar96 = ZEXT1632(auVar71);
    auVar103 = vpermt2ps_avx512vl(auVar100,_DAT_01fb9fc0,auVar96);
    auVar259 = ZEXT3264(auVar103);
    auVar231._0_4_ = fVar246 + auVar95._0_4_;
    auVar231._4_4_ = fVar251 + auVar95._4_4_;
    auVar231._8_4_ = fVar252 + auVar95._8_4_;
    auVar231._12_4_ = fVar253 + auVar95._12_4_;
    auVar231._16_4_ = fVar223 + auVar95._16_4_;
    auVar231._20_4_ = fVar224 + auVar95._20_4_;
    auVar231._24_4_ = fVar225 + auVar95._24_4_;
    auVar231._28_4_ = fVar15 + auVar95._28_4_;
    auVar80 = vmaxps_avx(auVar95,auVar231);
    auVar81 = vminps_avx(auVar95,auVar231);
    auVar104 = vpermt2ps_avx512vl(auVar95,_DAT_01fb9fc0,auVar96);
    auVar105 = vpermt2ps_avx512vl(auVar35,_DAT_01fb9fc0,auVar96);
    auVar106 = vpermt2ps_avx512vl(auVar36,_DAT_01fb9fc0,auVar96);
    auVar118 = ZEXT1632(auVar71);
    auVar107 = vpermt2ps_avx512vl(auVar37,_DAT_01fb9fc0,auVar118);
    auVar95 = vpermt2ps_avx512vl(auVar38,_DAT_01fb9fc0,auVar118);
    auVar108 = vsubps_avx512vl(auVar104,auVar95);
    auVar95 = vsubps_avx(auVar101,auVar98);
    auVar250 = ZEXT3264(auVar95);
    auVar96 = vsubps_avx(auVar102,auVar99);
    auVar245 = ZEXT3264(auVar96);
    auVar97 = vsubps_avx(auVar103,auVar100);
    auVar109 = vmulps_avx512vl(auVar96,auVar37);
    auVar109 = vfmsub231ps_avx512vl(auVar109,auVar36,auVar97);
    auVar110 = vmulps_avx512vl(auVar97,auVar35);
    auVar110 = vfmsub231ps_avx512vl(auVar110,auVar37,auVar95);
    auVar111 = vmulps_avx512vl(auVar95,auVar36);
    auVar111 = vfmsub231ps_avx512vl(auVar111,auVar35,auVar96);
    auVar111 = vmulps_avx512vl(auVar111,auVar111);
    auVar110 = vfmadd231ps_avx512vl(auVar111,auVar110,auVar110);
    auVar109 = vfmadd231ps_avx512vl(auVar110,auVar109,auVar109);
    auVar110 = vmulps_avx512vl(auVar97,auVar97);
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar96,auVar96);
    auVar111 = vfmadd231ps_avx512vl(auVar110,auVar95,auVar95);
    auVar110 = vrcp14ps_avx512vl(auVar111);
    auVar112 = vfnmadd213ps_avx512vl(auVar110,auVar111,auVar266);
    auVar110 = vfmadd132ps_avx512vl(auVar112,auVar110,auVar110);
    auVar109 = vmulps_avx512vl(auVar109,auVar110);
    auVar112 = vmulps_avx512vl(auVar96,auVar107);
    auVar112 = vfmsub231ps_avx512vl(auVar112,auVar106,auVar97);
    auVar113 = vmulps_avx512vl(auVar97,auVar105);
    auVar113 = vfmsub231ps_avx512vl(auVar113,auVar107,auVar95);
    auVar114 = vmulps_avx512vl(auVar95,auVar106);
    auVar114 = vfmsub231ps_avx512vl(auVar114,auVar105,auVar96);
    auVar114 = vmulps_avx512vl(auVar114,auVar114);
    auVar113 = vfmadd231ps_avx512vl(auVar114,auVar113,auVar113);
    auVar112 = vfmadd231ps_avx512vl(auVar113,auVar112,auVar112);
    auVar110 = vmulps_avx512vl(auVar112,auVar110);
    auVar109 = vmaxps_avx512vl(auVar109,auVar110);
    auVar109 = vsqrtps_avx512vl(auVar109);
    auVar110 = vmaxps_avx512vl(auVar108,auVar104);
    auVar80 = vmaxps_avx512vl(auVar80,auVar110);
    auVar112 = vaddps_avx512vl(auVar109,auVar80);
    auVar80 = vminps_avx512vl(auVar108,auVar104);
    auVar80 = vminps_avx(auVar81,auVar80);
    auVar80 = vsubps_avx512vl(auVar80,auVar109);
    auVar108._8_4_ = 0x3f800002;
    auVar108._0_8_ = 0x3f8000023f800002;
    auVar108._12_4_ = 0x3f800002;
    auVar108._16_4_ = 0x3f800002;
    auVar108._20_4_ = 0x3f800002;
    auVar108._24_4_ = 0x3f800002;
    auVar108._28_4_ = 0x3f800002;
    auVar81 = vmulps_avx512vl(auVar112,auVar108);
    auVar109._8_4_ = 0x3f7ffffc;
    auVar109._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar109._12_4_ = 0x3f7ffffc;
    auVar109._16_4_ = 0x3f7ffffc;
    auVar109._20_4_ = 0x3f7ffffc;
    auVar109._24_4_ = 0x3f7ffffc;
    auVar109._28_4_ = 0x3f7ffffc;
    auVar80 = vmulps_avx512vl(auVar80,auVar109);
    auVar81 = vmulps_avx512vl(auVar81,auVar81);
    auVar104 = vrsqrt14ps_avx512vl(auVar111);
    auVar110._8_4_ = 0xbf000000;
    auVar110._0_8_ = 0xbf000000bf000000;
    auVar110._12_4_ = 0xbf000000;
    auVar110._16_4_ = 0xbf000000;
    auVar110._20_4_ = 0xbf000000;
    auVar110._24_4_ = 0xbf000000;
    auVar110._28_4_ = 0xbf000000;
    auVar108 = vmulps_avx512vl(auVar111,auVar110);
    fVar246 = auVar104._0_4_;
    fVar251 = auVar104._4_4_;
    fVar252 = auVar104._8_4_;
    fVar253 = auVar104._12_4_;
    fVar223 = auVar104._16_4_;
    fVar224 = auVar104._20_4_;
    fVar225 = auVar104._24_4_;
    auVar39._4_4_ = fVar251 * fVar251 * fVar251 * auVar108._4_4_;
    auVar39._0_4_ = fVar246 * fVar246 * fVar246 * auVar108._0_4_;
    auVar39._8_4_ = fVar252 * fVar252 * fVar252 * auVar108._8_4_;
    auVar39._12_4_ = fVar253 * fVar253 * fVar253 * auVar108._12_4_;
    auVar39._16_4_ = fVar223 * fVar223 * fVar223 * auVar108._16_4_;
    auVar39._20_4_ = fVar224 * fVar224 * fVar224 * auVar108._20_4_;
    auVar39._24_4_ = fVar225 * fVar225 * fVar225 * auVar108._24_4_;
    auVar39._28_4_ = auVar112._28_4_;
    auVar111._8_4_ = 0x3fc00000;
    auVar111._0_8_ = 0x3fc000003fc00000;
    auVar111._12_4_ = 0x3fc00000;
    auVar111._16_4_ = 0x3fc00000;
    auVar111._20_4_ = 0x3fc00000;
    auVar111._24_4_ = 0x3fc00000;
    auVar111._28_4_ = 0x3fc00000;
    auVar104 = vfmadd231ps_avx512vl(auVar39,auVar104,auVar111);
    auVar108 = vmulps_avx512vl(auVar95,auVar104);
    auVar109 = vmulps_avx512vl(auVar96,auVar104);
    auVar110 = vmulps_avx512vl(auVar97,auVar104);
    auVar111 = vsubps_avx512vl(auVar118,auVar98);
    auVar112 = vsubps_avx512vl(auVar118,auVar99);
    auVar113 = vsubps_avx512vl(auVar118,auVar100);
    auVar114 = vmulps_avx512vl(local_5e0,auVar113);
    auVar114 = vfmadd231ps_avx512vl(auVar114,local_5c0,auVar112);
    auVar114 = vfmadd231ps_avx512vl(auVar114,local_5a0,auVar111);
    auVar115 = vmulps_avx512vl(auVar113,auVar113);
    auVar115 = vfmadd231ps_avx512vl(auVar115,auVar112,auVar112);
    auVar115 = vfmadd231ps_avx512vl(auVar115,auVar111,auVar111);
    auVar116 = vmulps_avx512vl(local_5e0,auVar110);
    auVar116 = vfmadd231ps_avx512vl(auVar116,auVar109,local_5c0);
    auVar116 = vfmadd231ps_avx512vl(auVar116,auVar108,local_5a0);
    auVar110 = vmulps_avx512vl(auVar113,auVar110);
    auVar109 = vfmadd231ps_avx512vl(auVar110,auVar112,auVar109);
    auVar108 = vfmadd231ps_avx512vl(auVar109,auVar111,auVar108);
    auVar109 = vmulps_avx512vl(auVar116,auVar116);
    auVar110 = vsubps_avx512vl(local_220,auVar109);
    auVar117 = vmulps_avx512vl(auVar116,auVar108);
    auVar114 = vsubps_avx512vl(auVar114,auVar117);
    auVar114 = vaddps_avx512vl(auVar114,auVar114);
    auVar117 = vmulps_avx512vl(auVar108,auVar108);
    local_800 = vsubps_avx512vl(auVar115,auVar117);
    auVar81 = vsubps_avx512vl(local_800,auVar81);
    local_740 = vmulps_avx512vl(auVar114,auVar114);
    auVar94 = vmulps_avx512vl(auVar110,auVar94);
    auVar115 = vmulps_avx512vl(auVar94,auVar81);
    auVar115 = vsubps_avx512vl(local_740,auVar115);
    uVar63 = vcmpps_avx512vl(auVar115,auVar118,5);
    bVar56 = (byte)uVar63;
    if (bVar56 == 0) {
LAB_01aa220b:
      auVar239 = ZEXT3264(_DAT_01f7b040);
    }
    else {
      auVar115 = vsqrtps_avx512vl(auVar115);
      auVar117 = vaddps_avx512vl(auVar110,auVar110);
      auVar118 = vrcp14ps_avx512vl(auVar117);
      auVar119 = vfnmadd213ps_avx512vl(auVar118,auVar117,auVar266);
      auVar119 = vfmadd132ps_avx512vl(auVar119,auVar118,auVar118);
      auVar266._8_4_ = 0x80000000;
      auVar266._0_8_ = 0x8000000080000000;
      auVar266._12_4_ = 0x80000000;
      auVar266._16_4_ = 0x80000000;
      auVar266._20_4_ = 0x80000000;
      auVar266._24_4_ = 0x80000000;
      auVar266._28_4_ = 0x80000000;
      _local_620 = vxorps_avx512vl(auVar114,auVar266);
      auVar120 = vsubps_avx512vl(_local_620,auVar115);
      local_600 = vmulps_avx512vl(auVar120,auVar119);
      auVar115 = vsubps_avx512vl(auVar115,auVar114);
      local_640 = vmulps_avx512vl(auVar115,auVar119);
      auVar115 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar119 = vblendmps_avx512vl(auVar115,local_600);
      auVar121._0_4_ =
           (uint)(bVar56 & 1) * auVar119._0_4_ | (uint)!(bool)(bVar56 & 1) * auVar115._0_4_;
      bVar67 = (bool)((byte)(uVar63 >> 1) & 1);
      auVar121._4_4_ = (uint)bVar67 * auVar119._4_4_ | (uint)!bVar67 * auVar115._4_4_;
      bVar67 = (bool)((byte)(uVar63 >> 2) & 1);
      auVar121._8_4_ = (uint)bVar67 * auVar119._8_4_ | (uint)!bVar67 * auVar115._8_4_;
      bVar67 = (bool)((byte)(uVar63 >> 3) & 1);
      auVar121._12_4_ = (uint)bVar67 * auVar119._12_4_ | (uint)!bVar67 * auVar115._12_4_;
      bVar67 = (bool)((byte)(uVar63 >> 4) & 1);
      auVar121._16_4_ = (uint)bVar67 * auVar119._16_4_ | (uint)!bVar67 * auVar115._16_4_;
      bVar67 = (bool)((byte)(uVar63 >> 5) & 1);
      auVar121._20_4_ = (uint)bVar67 * auVar119._20_4_ | (uint)!bVar67 * auVar115._20_4_;
      bVar67 = (bool)((byte)(uVar63 >> 6) & 1);
      auVar121._24_4_ = (uint)bVar67 * auVar119._24_4_ | (uint)!bVar67 * auVar115._24_4_;
      bVar67 = SUB81(uVar63 >> 7,0);
      auVar121._28_4_ = (uint)bVar67 * auVar119._28_4_ | (uint)!bVar67 * auVar115._28_4_;
      auVar115 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar119 = vblendmps_avx512vl(auVar115,local_640);
      auVar122._0_4_ =
           (uint)(bVar56 & 1) * auVar119._0_4_ | (uint)!(bool)(bVar56 & 1) * auVar115._0_4_;
      bVar67 = (bool)((byte)(uVar63 >> 1) & 1);
      auVar122._4_4_ = (uint)bVar67 * auVar119._4_4_ | (uint)!bVar67 * auVar115._4_4_;
      bVar67 = (bool)((byte)(uVar63 >> 2) & 1);
      auVar122._8_4_ = (uint)bVar67 * auVar119._8_4_ | (uint)!bVar67 * auVar115._8_4_;
      bVar67 = (bool)((byte)(uVar63 >> 3) & 1);
      auVar122._12_4_ = (uint)bVar67 * auVar119._12_4_ | (uint)!bVar67 * auVar115._12_4_;
      bVar67 = (bool)((byte)(uVar63 >> 4) & 1);
      auVar122._16_4_ = (uint)bVar67 * auVar119._16_4_ | (uint)!bVar67 * auVar115._16_4_;
      bVar67 = (bool)((byte)(uVar63 >> 5) & 1);
      auVar122._20_4_ = (uint)bVar67 * auVar119._20_4_ | (uint)!bVar67 * auVar115._20_4_;
      bVar67 = (bool)((byte)(uVar63 >> 6) & 1);
      auVar122._24_4_ = (uint)bVar67 * auVar119._24_4_ | (uint)!bVar67 * auVar115._24_4_;
      bVar67 = SUB81(uVar63 >> 7,0);
      auVar122._28_4_ = (uint)bVar67 * auVar119._28_4_ | (uint)!bVar67 * auVar115._28_4_;
      auVar115 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar109,auVar115);
      local_660 = vmaxps_avx512vl(local_240,auVar115);
      auVar27._8_4_ = 0x36000000;
      auVar27._0_8_ = 0x3600000036000000;
      auVar27._12_4_ = 0x36000000;
      auVar27._16_4_ = 0x36000000;
      auVar27._20_4_ = 0x36000000;
      auVar27._24_4_ = 0x36000000;
      auVar27._28_4_ = 0x36000000;
      local_680 = vmulps_avx512vl(local_660,auVar27);
      vandps_avx512vl(auVar110,auVar115);
      uVar65 = vcmpps_avx512vl(local_680,local_680,1);
      uVar63 = uVar63 & uVar65;
      bVar62 = (byte)uVar63;
      if (bVar62 != 0) {
        uVar65 = vcmpps_avx512vl(auVar81,_DAT_01f7b000,2);
        auVar81 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar109 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar110 = vblendmps_avx512vl(auVar81,auVar109);
        bVar61 = (byte)uVar65;
        uVar68 = (uint)(bVar61 & 1) * auVar110._0_4_ | (uint)!(bool)(bVar61 & 1) * local_680._0_4_;
        bVar67 = (bool)((byte)(uVar65 >> 1) & 1);
        uVar134 = (uint)bVar67 * auVar110._4_4_ | (uint)!bVar67 * local_680._4_4_;
        bVar67 = (bool)((byte)(uVar65 >> 2) & 1);
        uVar135 = (uint)bVar67 * auVar110._8_4_ | (uint)!bVar67 * local_680._8_4_;
        bVar67 = (bool)((byte)(uVar65 >> 3) & 1);
        uVar136 = (uint)bVar67 * auVar110._12_4_ | (uint)!bVar67 * local_680._12_4_;
        bVar67 = (bool)((byte)(uVar65 >> 4) & 1);
        uVar137 = (uint)bVar67 * auVar110._16_4_ | (uint)!bVar67 * local_680._16_4_;
        bVar67 = (bool)((byte)(uVar65 >> 5) & 1);
        uVar138 = (uint)bVar67 * auVar110._20_4_ | (uint)!bVar67 * local_680._20_4_;
        bVar67 = (bool)((byte)(uVar65 >> 6) & 1);
        uVar139 = (uint)bVar67 * auVar110._24_4_ | (uint)!bVar67 * local_680._24_4_;
        bVar67 = SUB81(uVar65 >> 7,0);
        uVar140 = (uint)bVar67 * auVar110._28_4_ | (uint)!bVar67 * local_680._28_4_;
        auVar121._0_4_ = (bVar62 & 1) * uVar68 | !(bool)(bVar62 & 1) * auVar121._0_4_;
        bVar67 = (bool)((byte)(uVar63 >> 1) & 1);
        auVar121._4_4_ = bVar67 * uVar134 | !bVar67 * auVar121._4_4_;
        bVar67 = (bool)((byte)(uVar63 >> 2) & 1);
        auVar121._8_4_ = bVar67 * uVar135 | !bVar67 * auVar121._8_4_;
        bVar67 = (bool)((byte)(uVar63 >> 3) & 1);
        auVar121._12_4_ = bVar67 * uVar136 | !bVar67 * auVar121._12_4_;
        bVar67 = (bool)((byte)(uVar63 >> 4) & 1);
        auVar121._16_4_ = bVar67 * uVar137 | !bVar67 * auVar121._16_4_;
        bVar67 = (bool)((byte)(uVar63 >> 5) & 1);
        auVar121._20_4_ = bVar67 * uVar138 | !bVar67 * auVar121._20_4_;
        bVar67 = (bool)((byte)(uVar63 >> 6) & 1);
        auVar121._24_4_ = bVar67 * uVar139 | !bVar67 * auVar121._24_4_;
        bVar67 = SUB81(uVar63 >> 7,0);
        auVar121._28_4_ = bVar67 * uVar140 | !bVar67 * auVar121._28_4_;
        auVar81 = vblendmps_avx512vl(auVar109,auVar81);
        bVar67 = (bool)((byte)(uVar65 >> 1) & 1);
        bVar6 = (bool)((byte)(uVar65 >> 2) & 1);
        bVar7 = (bool)((byte)(uVar65 >> 3) & 1);
        bVar8 = (bool)((byte)(uVar65 >> 4) & 1);
        bVar9 = (bool)((byte)(uVar65 >> 5) & 1);
        bVar10 = (bool)((byte)(uVar65 >> 6) & 1);
        bVar11 = SUB81(uVar65 >> 7,0);
        auVar122._0_4_ =
             (uint)(bVar62 & 1) *
             ((uint)(bVar61 & 1) * auVar81._0_4_ | !(bool)(bVar61 & 1) * uVar68) |
             !(bool)(bVar62 & 1) * auVar122._0_4_;
        bVar5 = (bool)((byte)(uVar63 >> 1) & 1);
        auVar122._4_4_ =
             (uint)bVar5 * ((uint)bVar67 * auVar81._4_4_ | !bVar67 * uVar134) |
             !bVar5 * auVar122._4_4_;
        bVar67 = (bool)((byte)(uVar63 >> 2) & 1);
        auVar122._8_4_ =
             (uint)bVar67 * ((uint)bVar6 * auVar81._8_4_ | !bVar6 * uVar135) |
             !bVar67 * auVar122._8_4_;
        bVar67 = (bool)((byte)(uVar63 >> 3) & 1);
        auVar122._12_4_ =
             (uint)bVar67 * ((uint)bVar7 * auVar81._12_4_ | !bVar7 * uVar136) |
             !bVar67 * auVar122._12_4_;
        bVar67 = (bool)((byte)(uVar63 >> 4) & 1);
        auVar122._16_4_ =
             (uint)bVar67 * ((uint)bVar8 * auVar81._16_4_ | !bVar8 * uVar137) |
             !bVar67 * auVar122._16_4_;
        bVar67 = (bool)((byte)(uVar63 >> 5) & 1);
        auVar122._20_4_ =
             (uint)bVar67 * ((uint)bVar9 * auVar81._20_4_ | !bVar9 * uVar138) |
             !bVar67 * auVar122._20_4_;
        bVar67 = (bool)((byte)(uVar63 >> 6) & 1);
        auVar122._24_4_ =
             (uint)bVar67 * ((uint)bVar10 * auVar81._24_4_ | !bVar10 * uVar139) |
             !bVar67 * auVar122._24_4_;
        bVar67 = SUB81(uVar63 >> 7,0);
        auVar122._28_4_ =
             (uint)bVar67 * ((uint)bVar11 * auVar81._28_4_ | !bVar11 * uVar140) |
             !bVar67 * auVar122._28_4_;
        bVar56 = (~bVar62 | bVar61) & bVar56;
      }
      if ((bVar56 & 0x7f) == 0) {
        auVar80 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar267 = ZEXT3264(auVar80);
        auVar239 = ZEXT3264(_DAT_01f7b040);
      }
      else {
        auVar81 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar107 = vxorps_avx512vl(auVar107,auVar81);
        auVar105 = vxorps_avx512vl(auVar105,auVar81);
        auVar239 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
        auVar106 = vxorps_avx512vl(auVar106,auVar81);
        auVar71 = vsubss_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                                 ZEXT416((uint)local_6f0._0_4_));
        auVar109 = vbroadcastss_avx512vl(auVar71);
        auVar109 = vminps_avx512vl(auVar109,auVar122);
        auVar55._4_4_ = fStack_2dc;
        auVar55._0_4_ = local_2e0;
        auVar55._8_4_ = fStack_2d8;
        auVar55._12_4_ = fStack_2d4;
        auVar55._16_4_ = fStack_2d0;
        auVar55._20_4_ = fStack_2cc;
        auVar55._24_4_ = fStack_2c8;
        auVar55._28_4_ = fStack_2c4;
        auVar110 = vmaxps_avx512vl(auVar55,auVar121);
        auVar113 = vmulps_avx512vl(auVar37,auVar113);
        auVar112 = vfmadd213ps_avx512vl(auVar112,auVar36,auVar113);
        auVar71 = vfmadd213ps_fma(auVar111,auVar35,auVar112);
        auVar111 = vmulps_avx512vl(local_5e0,auVar37);
        auVar111 = vfmadd231ps_avx512vl(auVar111,local_5c0,auVar36);
        auVar111 = vfmadd231ps_avx512vl(auVar111,local_5a0,auVar35);
        auVar112 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        vandps_avx512vl(auVar111,auVar112);
        auVar113 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
        uVar16 = vcmpps_avx512vl(auVar112,auVar113,1);
        auVar115 = vxorps_avx512vl(ZEXT1632(auVar71),auVar81);
        auVar119 = vrcp14ps_avx512vl(auVar111);
        auVar120 = vxorps_avx512vl(auVar111,auVar81);
        auVar123 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar124 = vfnmadd213ps_avx512vl(auVar119,auVar111,auVar123);
        auVar71 = vfmadd132ps_fma(auVar124,auVar119,auVar119);
        fVar246 = auVar71._0_4_ * auVar115._0_4_;
        fVar251 = auVar71._4_4_ * auVar115._4_4_;
        auVar40._4_4_ = fVar251;
        auVar40._0_4_ = fVar246;
        fVar252 = auVar71._8_4_ * auVar115._8_4_;
        auVar40._8_4_ = fVar252;
        fVar253 = auVar71._12_4_ * auVar115._12_4_;
        auVar40._12_4_ = fVar253;
        fVar223 = auVar115._16_4_ * 0.0;
        auVar40._16_4_ = fVar223;
        fVar224 = auVar115._20_4_ * 0.0;
        auVar40._20_4_ = fVar224;
        fVar225 = auVar115._24_4_ * 0.0;
        auVar40._24_4_ = fVar225;
        auVar40._28_4_ = auVar115._28_4_;
        uVar18 = vcmpps_avx512vl(auVar111,auVar120,1);
        bVar62 = (byte)uVar16 | (byte)uVar18;
        auVar264._8_4_ = 0xff800000;
        auVar264._0_8_ = 0xff800000ff800000;
        auVar264._12_4_ = 0xff800000;
        auVar264._16_4_ = 0xff800000;
        auVar264._20_4_ = 0xff800000;
        auVar264._24_4_ = 0xff800000;
        auVar264._28_4_ = 0xff800000;
        auVar124 = vblendmps_avx512vl(auVar40,auVar264);
        auVar125._0_4_ =
             (uint)(bVar62 & 1) * auVar124._0_4_ | (uint)!(bool)(bVar62 & 1) * auVar119._0_4_;
        bVar67 = (bool)(bVar62 >> 1 & 1);
        auVar125._4_4_ = (uint)bVar67 * auVar124._4_4_ | (uint)!bVar67 * auVar119._4_4_;
        bVar67 = (bool)(bVar62 >> 2 & 1);
        auVar125._8_4_ = (uint)bVar67 * auVar124._8_4_ | (uint)!bVar67 * auVar119._8_4_;
        bVar67 = (bool)(bVar62 >> 3 & 1);
        auVar125._12_4_ = (uint)bVar67 * auVar124._12_4_ | (uint)!bVar67 * auVar119._12_4_;
        bVar67 = (bool)(bVar62 >> 4 & 1);
        auVar125._16_4_ = (uint)bVar67 * auVar124._16_4_ | (uint)!bVar67 * auVar119._16_4_;
        bVar67 = (bool)(bVar62 >> 5 & 1);
        auVar125._20_4_ = (uint)bVar67 * auVar124._20_4_ | (uint)!bVar67 * auVar119._20_4_;
        bVar67 = (bool)(bVar62 >> 6 & 1);
        auVar125._24_4_ = (uint)bVar67 * auVar124._24_4_ | (uint)!bVar67 * auVar119._24_4_;
        auVar125._28_4_ =
             (uint)(bVar62 >> 7) * auVar124._28_4_ | (uint)!(bool)(bVar62 >> 7) * auVar119._28_4_;
        auVar110 = vmaxps_avx512vl(auVar110,auVar125);
        auVar263 = ZEXT3264(auVar110);
        uVar18 = vcmpps_avx512vl(auVar111,auVar120,6);
        bVar62 = (byte)uVar16 | (byte)uVar18;
        auVar111 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar126._0_4_ =
             (uint)(bVar62 & 1) * auVar111._0_4_ | (uint)!(bool)(bVar62 & 1) * (int)fVar246;
        bVar67 = (bool)(bVar62 >> 1 & 1);
        auVar126._4_4_ = (uint)bVar67 * auVar111._4_4_ | (uint)!bVar67 * (int)fVar251;
        bVar67 = (bool)(bVar62 >> 2 & 1);
        auVar126._8_4_ = (uint)bVar67 * auVar111._8_4_ | (uint)!bVar67 * (int)fVar252;
        bVar67 = (bool)(bVar62 >> 3 & 1);
        auVar126._12_4_ = (uint)bVar67 * auVar111._12_4_ | (uint)!bVar67 * (int)fVar253;
        bVar67 = (bool)(bVar62 >> 4 & 1);
        auVar126._16_4_ = (uint)bVar67 * auVar111._16_4_ | (uint)!bVar67 * (int)fVar223;
        bVar67 = (bool)(bVar62 >> 5 & 1);
        auVar126._20_4_ = (uint)bVar67 * auVar111._20_4_ | (uint)!bVar67 * (int)fVar224;
        bVar67 = (bool)(bVar62 >> 6 & 1);
        auVar126._24_4_ = (uint)bVar67 * auVar111._24_4_ | (uint)!bVar67 * (int)fVar225;
        auVar126._28_4_ =
             (uint)(bVar62 >> 7) * auVar111._28_4_ | (uint)!(bool)(bVar62 >> 7) * auVar115._28_4_;
        auVar115 = vminps_avx512vl(auVar109,auVar126);
        auVar72 = vxorps_avx512vl(auVar109._0_16_,auVar109._0_16_);
        auVar101 = vsubps_avx512vl(ZEXT1632(auVar72),auVar101);
        auVar102 = vsubps_avx512vl(ZEXT1632(auVar72),auVar102);
        auVar103 = vsubps_avx512vl(ZEXT1632(auVar72),auVar103);
        auVar103 = vmulps_avx512vl(auVar103,auVar107);
        auVar102 = vfmadd231ps_avx512vl(auVar103,auVar106,auVar102);
        auVar101 = vfmadd231ps_avx512vl(auVar102,auVar105,auVar101);
        auVar102 = vmulps_avx512vl(local_5e0,auVar107);
        auVar102 = vfmadd231ps_avx512vl(auVar102,local_5c0,auVar106);
        auVar102 = vfmadd231ps_avx512vl(auVar102,local_5a0,auVar105);
        auVar267 = ZEXT3264(auVar123);
        vandps_avx512vl(auVar102,auVar112);
        uVar16 = vcmpps_avx512vl(auVar123,auVar113,1);
        auVar101 = vxorps_avx512vl(auVar101,auVar81);
        auVar103 = vrcp14ps_avx512vl(auVar102);
        auVar105 = vxorps_avx512vl(auVar102,auVar81);
        auVar259 = ZEXT3264(auVar105);
        auVar81 = vfnmadd213ps_avx512vl(auVar103,auVar102,auVar123);
        auVar71 = vfmadd132ps_fma(auVar81,auVar103,auVar103);
        fVar246 = auVar71._0_4_ * auVar101._0_4_;
        fVar251 = auVar71._4_4_ * auVar101._4_4_;
        auVar41._4_4_ = fVar251;
        auVar41._0_4_ = fVar246;
        fVar252 = auVar71._8_4_ * auVar101._8_4_;
        auVar41._8_4_ = fVar252;
        fVar253 = auVar71._12_4_ * auVar101._12_4_;
        auVar41._12_4_ = fVar253;
        fVar223 = auVar101._16_4_ * 0.0;
        auVar41._16_4_ = fVar223;
        fVar224 = auVar101._20_4_ * 0.0;
        auVar41._20_4_ = fVar224;
        fVar225 = auVar101._24_4_ * 0.0;
        auVar41._24_4_ = fVar225;
        auVar41._28_4_ = auVar101._28_4_;
        uVar18 = vcmpps_avx512vl(auVar102,auVar105,1);
        bVar62 = (byte)uVar16 | (byte)uVar18;
        auVar81 = vblendmps_avx512vl(auVar41,auVar264);
        auVar127._0_4_ =
             (uint)(bVar62 & 1) * auVar81._0_4_ | (uint)!(bool)(bVar62 & 1) * auVar103._0_4_;
        bVar67 = (bool)(bVar62 >> 1 & 1);
        auVar127._4_4_ = (uint)bVar67 * auVar81._4_4_ | (uint)!bVar67 * auVar103._4_4_;
        bVar67 = (bool)(bVar62 >> 2 & 1);
        auVar127._8_4_ = (uint)bVar67 * auVar81._8_4_ | (uint)!bVar67 * auVar103._8_4_;
        bVar67 = (bool)(bVar62 >> 3 & 1);
        auVar127._12_4_ = (uint)bVar67 * auVar81._12_4_ | (uint)!bVar67 * auVar103._12_4_;
        bVar67 = (bool)(bVar62 >> 4 & 1);
        auVar127._16_4_ = (uint)bVar67 * auVar81._16_4_ | (uint)!bVar67 * auVar103._16_4_;
        bVar67 = (bool)(bVar62 >> 5 & 1);
        auVar127._20_4_ = (uint)bVar67 * auVar81._20_4_ | (uint)!bVar67 * auVar103._20_4_;
        bVar67 = (bool)(bVar62 >> 6 & 1);
        auVar127._24_4_ = (uint)bVar67 * auVar81._24_4_ | (uint)!bVar67 * auVar103._24_4_;
        auVar127._28_4_ =
             (uint)(bVar62 >> 7) * auVar81._28_4_ | (uint)!(bool)(bVar62 >> 7) * auVar103._28_4_;
        auVar81 = vmaxps_avx(auVar110,auVar127);
        auVar257 = ZEXT3264(auVar81);
        uVar18 = vcmpps_avx512vl(auVar102,auVar105,6);
        bVar62 = (byte)uVar16 | (byte)uVar18;
        auVar128._0_4_ =
             (uint)(bVar62 & 1) * auVar111._0_4_ | (uint)!(bool)(bVar62 & 1) * (int)fVar246;
        bVar67 = (bool)(bVar62 >> 1 & 1);
        auVar128._4_4_ = (uint)bVar67 * auVar111._4_4_ | (uint)!bVar67 * (int)fVar251;
        bVar67 = (bool)(bVar62 >> 2 & 1);
        auVar128._8_4_ = (uint)bVar67 * auVar111._8_4_ | (uint)!bVar67 * (int)fVar252;
        bVar67 = (bool)(bVar62 >> 3 & 1);
        auVar128._12_4_ = (uint)bVar67 * auVar111._12_4_ | (uint)!bVar67 * (int)fVar253;
        bVar67 = (bool)(bVar62 >> 4 & 1);
        auVar128._16_4_ = (uint)bVar67 * auVar111._16_4_ | (uint)!bVar67 * (int)fVar223;
        bVar67 = (bool)(bVar62 >> 5 & 1);
        auVar128._20_4_ = (uint)bVar67 * auVar111._20_4_ | (uint)!bVar67 * (int)fVar224;
        bVar67 = (bool)(bVar62 >> 6 & 1);
        auVar128._24_4_ = (uint)bVar67 * auVar111._24_4_ | (uint)!bVar67 * (int)fVar225;
        auVar128._28_4_ =
             (uint)(bVar62 >> 7) * auVar111._28_4_ | (uint)!(bool)(bVar62 >> 7) * auVar101._28_4_;
        local_340 = vminps_avx(auVar115,auVar128);
        auVar255 = ZEXT3264(local_340);
        uVar16 = vcmpps_avx512vl(auVar81,local_340,2);
        bVar56 = bVar56 & 0x7f & (byte)uVar16;
        if (bVar56 == 0) goto LAB_01aa220b;
        auVar102 = vmaxps_avx512vl(ZEXT1632(auVar72),auVar80);
        auVar80 = vfmadd213ps_avx512vl(local_600,auVar116,auVar108);
        fVar246 = auVar104._0_4_;
        fVar251 = auVar104._4_4_;
        auVar42._4_4_ = fVar251 * auVar80._4_4_;
        auVar42._0_4_ = fVar246 * auVar80._0_4_;
        fVar252 = auVar104._8_4_;
        auVar42._8_4_ = fVar252 * auVar80._8_4_;
        fVar253 = auVar104._12_4_;
        auVar42._12_4_ = fVar253 * auVar80._12_4_;
        fVar223 = auVar104._16_4_;
        auVar42._16_4_ = fVar223 * auVar80._16_4_;
        fVar224 = auVar104._20_4_;
        auVar42._20_4_ = fVar224 * auVar80._20_4_;
        fVar225 = auVar104._24_4_;
        auVar42._24_4_ = fVar225 * auVar80._24_4_;
        auVar42._28_4_ = auVar80._28_4_;
        auVar80 = vfmadd213ps_avx512vl(local_640,auVar116,auVar108);
        auVar43._4_4_ = fVar251 * auVar80._4_4_;
        auVar43._0_4_ = fVar246 * auVar80._0_4_;
        auVar43._8_4_ = fVar252 * auVar80._8_4_;
        auVar43._12_4_ = fVar253 * auVar80._12_4_;
        auVar43._16_4_ = fVar223 * auVar80._16_4_;
        auVar43._20_4_ = fVar224 * auVar80._20_4_;
        auVar43._24_4_ = fVar225 * auVar80._24_4_;
        auVar43._28_4_ = auVar80._28_4_;
        auVar80 = vminps_avx512vl(auVar42,auVar123);
        auVar50 = ZEXT812(0);
        auVar101 = ZEXT1232(auVar50) << 0x20;
        auVar80 = vmaxps_avx(auVar80,ZEXT1232(auVar50) << 0x20);
        auVar103 = vminps_avx512vl(auVar43,auVar123);
        auVar44._4_4_ = (auVar80._4_4_ + 1.0) * 0.125;
        auVar44._0_4_ = (auVar80._0_4_ + 0.0) * 0.125;
        auVar44._8_4_ = (auVar80._8_4_ + 2.0) * 0.125;
        auVar44._12_4_ = (auVar80._12_4_ + 3.0) * 0.125;
        auVar44._16_4_ = (auVar80._16_4_ + 4.0) * 0.125;
        auVar44._20_4_ = (auVar80._20_4_ + 5.0) * 0.125;
        auVar44._24_4_ = (auVar80._24_4_ + 6.0) * 0.125;
        auVar44._28_4_ = auVar80._28_4_ + 7.0;
        local_1e0 = vfmadd213ps_avx512vl(auVar44,auVar151,auVar229);
        auVar80 = vmaxps_avx(auVar103,ZEXT1232(auVar50) << 0x20);
        auVar45._4_4_ = (auVar80._4_4_ + 1.0) * 0.125;
        auVar45._0_4_ = (auVar80._0_4_ + 0.0) * 0.125;
        auVar45._8_4_ = (auVar80._8_4_ + 2.0) * 0.125;
        auVar45._12_4_ = (auVar80._12_4_ + 3.0) * 0.125;
        auVar45._16_4_ = (auVar80._16_4_ + 4.0) * 0.125;
        auVar45._20_4_ = (auVar80._20_4_ + 5.0) * 0.125;
        auVar45._24_4_ = (auVar80._24_4_ + 6.0) * 0.125;
        auVar45._28_4_ = auVar80._28_4_ + 7.0;
        local_200 = vfmadd213ps_avx512vl(auVar45,auVar151,auVar229);
        auVar46._4_4_ = auVar102._4_4_ * auVar102._4_4_;
        auVar46._0_4_ = auVar102._0_4_ * auVar102._0_4_;
        auVar46._8_4_ = auVar102._8_4_ * auVar102._8_4_;
        auVar46._12_4_ = auVar102._12_4_ * auVar102._12_4_;
        auVar46._16_4_ = auVar102._16_4_ * auVar102._16_4_;
        auVar46._20_4_ = auVar102._20_4_ * auVar102._20_4_;
        auVar46._24_4_ = auVar102._24_4_ * auVar102._24_4_;
        auVar46._28_4_ = auVar102._28_4_;
        auVar80 = vsubps_avx(local_800,auVar46);
        local_8a0 = auVar94._0_4_;
        fStack_89c = auVar94._4_4_;
        fStack_898 = auVar94._8_4_;
        fStack_894 = auVar94._12_4_;
        fStack_890 = auVar94._16_4_;
        fStack_88c = auVar94._20_4_;
        fStack_888 = auVar94._24_4_;
        auVar47._4_4_ = auVar80._4_4_ * fStack_89c;
        auVar47._0_4_ = auVar80._0_4_ * local_8a0;
        auVar47._8_4_ = auVar80._8_4_ * fStack_898;
        auVar47._12_4_ = auVar80._12_4_ * fStack_894;
        auVar47._16_4_ = auVar80._16_4_ * fStack_890;
        auVar47._20_4_ = auVar80._20_4_ * fStack_88c;
        auVar47._24_4_ = auVar80._24_4_ * fStack_888;
        auVar47._28_4_ = auVar102._28_4_;
        auVar94 = vsubps_avx(local_740,auVar47);
        uVar16 = vcmpps_avx512vl(auVar94,ZEXT1232(auVar50) << 0x20,5);
        bVar62 = (byte)uVar16;
        if (bVar62 == 0) {
          bVar62 = 0;
          auVar95 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar245 = ZEXT864(0) << 0x20;
          auVar94 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar102 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar257 = ZEXT864(0) << 0x20;
          auVar129._8_4_ = 0x7f800000;
          auVar129._0_8_ = 0x7f8000007f800000;
          auVar129._12_4_ = 0x7f800000;
          auVar129._16_4_ = 0x7f800000;
          auVar129._20_4_ = 0x7f800000;
          auVar129._24_4_ = 0x7f800000;
          auVar129._28_4_ = 0x7f800000;
          auVar130._8_4_ = 0xff800000;
          auVar130._0_8_ = 0xff800000ff800000;
          auVar130._12_4_ = 0xff800000;
          auVar130._16_4_ = 0xff800000;
          auVar130._20_4_ = 0xff800000;
          auVar130._24_4_ = 0xff800000;
          auVar130._28_4_ = 0xff800000;
        }
        else {
          auVar72 = vxorps_avx512vl(auVar143,auVar143);
          uVar63 = vcmpps_avx512vl(auVar94,ZEXT1232(ZEXT812(0)) << 0x20,5);
          auVar94 = vsqrtps_avx(auVar94);
          auVar101 = vfnmadd213ps_avx512vl(auVar117,auVar118,auVar123);
          auVar102 = vfmadd132ps_avx512vl(auVar101,auVar118,auVar118);
          auVar101 = vsubps_avx(_local_620,auVar94);
          auVar105 = vmulps_avx512vl(auVar101,auVar102);
          auVar94 = vsubps_avx512vl(auVar94,auVar114);
          auVar106 = vmulps_avx512vl(auVar94,auVar102);
          auVar94 = vfmadd213ps_avx512vl(auVar116,auVar105,auVar108);
          auVar48._4_4_ = fVar251 * auVar94._4_4_;
          auVar48._0_4_ = fVar246 * auVar94._0_4_;
          auVar48._8_4_ = fVar252 * auVar94._8_4_;
          auVar48._12_4_ = fVar253 * auVar94._12_4_;
          auVar48._16_4_ = fVar223 * auVar94._16_4_;
          auVar48._20_4_ = fVar224 * auVar94._20_4_;
          auVar48._24_4_ = fVar225 * auVar94._24_4_;
          auVar48._28_4_ = auVar103._28_4_;
          auVar94 = vmulps_avx512vl(local_5a0,auVar105);
          auVar101 = vmulps_avx512vl(local_5c0,auVar105);
          auVar103 = vmulps_avx512vl(local_5e0,auVar105);
          auVar102 = vfmadd213ps_avx512vl(auVar95,auVar48,auVar98);
          auVar94 = vsubps_avx512vl(auVar94,auVar102);
          auVar102 = vfmadd213ps_avx512vl(auVar96,auVar48,auVar99);
          auVar102 = vsubps_avx512vl(auVar101,auVar102);
          auVar71 = vfmadd213ps_fma(auVar48,auVar97,auVar100);
          auVar101 = vsubps_avx(auVar103,ZEXT1632(auVar71));
          auVar257 = ZEXT3264(auVar101);
          auVar101 = vfmadd213ps_avx512vl(auVar116,auVar106,auVar108);
          auVar103 = vmulps_avx512vl(auVar104,auVar101);
          auVar101 = vmulps_avx512vl(local_5a0,auVar106);
          auVar104 = vmulps_avx512vl(local_5c0,auVar106);
          auVar107 = vmulps_avx512vl(local_5e0,auVar106);
          auVar71 = vfmadd213ps_fma(auVar95,auVar103,auVar98);
          auVar101 = vsubps_avx(auVar101,ZEXT1632(auVar71));
          auVar71 = vfmadd213ps_fma(auVar96,auVar103,auVar99);
          auVar95 = vsubps_avx512vl(auVar104,ZEXT1632(auVar71));
          auVar71 = vfmadd213ps_fma(auVar97,auVar103,auVar100);
          auVar96 = vsubps_avx512vl(auVar107,ZEXT1632(auVar71));
          auVar245 = ZEXT3264(auVar96);
          auVar152._8_4_ = 0x7f800000;
          auVar152._0_8_ = 0x7f8000007f800000;
          auVar152._12_4_ = 0x7f800000;
          auVar152._16_4_ = 0x7f800000;
          auVar152._20_4_ = 0x7f800000;
          auVar152._24_4_ = 0x7f800000;
          auVar152._28_4_ = 0x7f800000;
          auVar96 = vblendmps_avx512vl(auVar152,auVar105);
          bVar67 = (bool)((byte)uVar63 & 1);
          auVar129._0_4_ = (uint)bVar67 * auVar96._0_4_ | (uint)!bVar67 * 0x7f800000;
          bVar67 = (bool)((byte)(uVar63 >> 1) & 1);
          auVar129._4_4_ = (uint)bVar67 * auVar96._4_4_ | (uint)!bVar67 * 0x7f800000;
          bVar67 = (bool)((byte)(uVar63 >> 2) & 1);
          auVar129._8_4_ = (uint)bVar67 * auVar96._8_4_ | (uint)!bVar67 * 0x7f800000;
          bVar67 = (bool)((byte)(uVar63 >> 3) & 1);
          auVar129._12_4_ = (uint)bVar67 * auVar96._12_4_ | (uint)!bVar67 * 0x7f800000;
          bVar67 = (bool)((byte)(uVar63 >> 4) & 1);
          auVar129._16_4_ = (uint)bVar67 * auVar96._16_4_ | (uint)!bVar67 * 0x7f800000;
          bVar67 = (bool)((byte)(uVar63 >> 5) & 1);
          auVar129._20_4_ = (uint)bVar67 * auVar96._20_4_ | (uint)!bVar67 * 0x7f800000;
          bVar67 = (bool)((byte)(uVar63 >> 6) & 1);
          auVar129._24_4_ = (uint)bVar67 * auVar96._24_4_ | (uint)!bVar67 * 0x7f800000;
          bVar67 = SUB81(uVar63 >> 7,0);
          auVar129._28_4_ = (uint)bVar67 * auVar96._28_4_ | (uint)!bVar67 * 0x7f800000;
          auVar201._8_4_ = 0xff800000;
          auVar201._0_8_ = 0xff800000ff800000;
          auVar201._12_4_ = 0xff800000;
          auVar201._16_4_ = 0xff800000;
          auVar201._20_4_ = 0xff800000;
          auVar201._24_4_ = 0xff800000;
          auVar201._28_4_ = 0xff800000;
          auVar96 = vblendmps_avx512vl(auVar201,auVar106);
          bVar67 = (bool)((byte)uVar63 & 1);
          auVar130._0_4_ = (uint)bVar67 * auVar96._0_4_ | (uint)!bVar67 * -0x800000;
          bVar67 = (bool)((byte)(uVar63 >> 1) & 1);
          auVar130._4_4_ = (uint)bVar67 * auVar96._4_4_ | (uint)!bVar67 * -0x800000;
          bVar67 = (bool)((byte)(uVar63 >> 2) & 1);
          auVar130._8_4_ = (uint)bVar67 * auVar96._8_4_ | (uint)!bVar67 * -0x800000;
          bVar67 = (bool)((byte)(uVar63 >> 3) & 1);
          auVar130._12_4_ = (uint)bVar67 * auVar96._12_4_ | (uint)!bVar67 * -0x800000;
          bVar67 = (bool)((byte)(uVar63 >> 4) & 1);
          auVar130._16_4_ = (uint)bVar67 * auVar96._16_4_ | (uint)!bVar67 * -0x800000;
          bVar67 = (bool)((byte)(uVar63 >> 5) & 1);
          auVar130._20_4_ = (uint)bVar67 * auVar96._20_4_ | (uint)!bVar67 * -0x800000;
          bVar67 = (bool)((byte)(uVar63 >> 6) & 1);
          auVar130._24_4_ = (uint)bVar67 * auVar96._24_4_ | (uint)!bVar67 * -0x800000;
          bVar67 = SUB81(uVar63 >> 7,0);
          auVar130._28_4_ = (uint)bVar67 * auVar96._28_4_ | (uint)!bVar67 * -0x800000;
          auVar28._8_4_ = 0x36000000;
          auVar28._0_8_ = 0x3600000036000000;
          auVar28._12_4_ = 0x36000000;
          auVar28._16_4_ = 0x36000000;
          auVar28._20_4_ = 0x36000000;
          auVar28._24_4_ = 0x36000000;
          auVar28._28_4_ = 0x36000000;
          auVar96 = vmulps_avx512vl(local_660,auVar28);
          uVar65 = vcmpps_avx512vl(auVar96,local_680,0xe);
          uVar63 = uVar63 & uVar65;
          bVar61 = (byte)uVar63;
          if (bVar61 != 0) {
            uVar65 = vcmpps_avx512vl(auVar80,ZEXT1632(auVar72),2);
            auVar249._8_4_ = 0x7f800000;
            auVar249._0_8_ = 0x7f8000007f800000;
            auVar249._12_4_ = 0x7f800000;
            auVar249._16_4_ = 0x7f800000;
            auVar249._20_4_ = 0x7f800000;
            auVar249._24_4_ = 0x7f800000;
            auVar249._28_4_ = 0x7f800000;
            auVar262._8_4_ = 0xff800000;
            auVar262._0_8_ = 0xff800000ff800000;
            auVar262._12_4_ = 0xff800000;
            auVar262._16_4_ = 0xff800000;
            auVar262._20_4_ = 0xff800000;
            auVar262._24_4_ = 0xff800000;
            auVar262._28_4_ = 0xff800000;
            auVar80 = vblendmps_avx512vl(auVar249,auVar262);
            bVar57 = (byte)uVar65;
            uVar68 = (uint)(bVar57 & 1) * auVar80._0_4_ | (uint)!(bool)(bVar57 & 1) * auVar96._0_4_;
            bVar67 = (bool)((byte)(uVar65 >> 1) & 1);
            uVar134 = (uint)bVar67 * auVar80._4_4_ | (uint)!bVar67 * auVar96._4_4_;
            bVar67 = (bool)((byte)(uVar65 >> 2) & 1);
            uVar135 = (uint)bVar67 * auVar80._8_4_ | (uint)!bVar67 * auVar96._8_4_;
            bVar67 = (bool)((byte)(uVar65 >> 3) & 1);
            uVar136 = (uint)bVar67 * auVar80._12_4_ | (uint)!bVar67 * auVar96._12_4_;
            bVar67 = (bool)((byte)(uVar65 >> 4) & 1);
            uVar137 = (uint)bVar67 * auVar80._16_4_ | (uint)!bVar67 * auVar96._16_4_;
            bVar67 = (bool)((byte)(uVar65 >> 5) & 1);
            uVar138 = (uint)bVar67 * auVar80._20_4_ | (uint)!bVar67 * auVar96._20_4_;
            bVar67 = (bool)((byte)(uVar65 >> 6) & 1);
            uVar139 = (uint)bVar67 * auVar80._24_4_ | (uint)!bVar67 * auVar96._24_4_;
            bVar67 = SUB81(uVar65 >> 7,0);
            uVar140 = (uint)bVar67 * auVar80._28_4_ | (uint)!bVar67 * auVar96._28_4_;
            auVar129._0_4_ = (bVar61 & 1) * uVar68 | !(bool)(bVar61 & 1) * auVar129._0_4_;
            bVar67 = (bool)((byte)(uVar63 >> 1) & 1);
            auVar129._4_4_ = bVar67 * uVar134 | !bVar67 * auVar129._4_4_;
            bVar67 = (bool)((byte)(uVar63 >> 2) & 1);
            auVar129._8_4_ = bVar67 * uVar135 | !bVar67 * auVar129._8_4_;
            bVar67 = (bool)((byte)(uVar63 >> 3) & 1);
            auVar129._12_4_ = bVar67 * uVar136 | !bVar67 * auVar129._12_4_;
            bVar67 = (bool)((byte)(uVar63 >> 4) & 1);
            auVar129._16_4_ = bVar67 * uVar137 | !bVar67 * auVar129._16_4_;
            bVar67 = (bool)((byte)(uVar63 >> 5) & 1);
            auVar129._20_4_ = bVar67 * uVar138 | !bVar67 * auVar129._20_4_;
            bVar67 = (bool)((byte)(uVar63 >> 6) & 1);
            auVar129._24_4_ = bVar67 * uVar139 | !bVar67 * auVar129._24_4_;
            bVar67 = SUB81(uVar63 >> 7,0);
            auVar129._28_4_ = bVar67 * uVar140 | !bVar67 * auVar129._28_4_;
            auVar80 = vblendmps_avx512vl(auVar262,auVar249);
            bVar67 = (bool)((byte)(uVar65 >> 1) & 1);
            bVar6 = (bool)((byte)(uVar65 >> 2) & 1);
            bVar7 = (bool)((byte)(uVar65 >> 3) & 1);
            bVar8 = (bool)((byte)(uVar65 >> 4) & 1);
            bVar9 = (bool)((byte)(uVar65 >> 5) & 1);
            bVar10 = (bool)((byte)(uVar65 >> 6) & 1);
            bVar11 = SUB81(uVar65 >> 7,0);
            auVar130._0_4_ =
                 (uint)(bVar61 & 1) *
                 ((uint)(bVar57 & 1) * auVar80._0_4_ | !(bool)(bVar57 & 1) * uVar68) |
                 !(bool)(bVar61 & 1) * auVar130._0_4_;
            bVar5 = (bool)((byte)(uVar63 >> 1) & 1);
            auVar130._4_4_ =
                 (uint)bVar5 * ((uint)bVar67 * auVar80._4_4_ | !bVar67 * uVar134) |
                 !bVar5 * auVar130._4_4_;
            bVar67 = (bool)((byte)(uVar63 >> 2) & 1);
            auVar130._8_4_ =
                 (uint)bVar67 * ((uint)bVar6 * auVar80._8_4_ | !bVar6 * uVar135) |
                 !bVar67 * auVar130._8_4_;
            bVar67 = (bool)((byte)(uVar63 >> 3) & 1);
            auVar130._12_4_ =
                 (uint)bVar67 * ((uint)bVar7 * auVar80._12_4_ | !bVar7 * uVar136) |
                 !bVar67 * auVar130._12_4_;
            bVar67 = (bool)((byte)(uVar63 >> 4) & 1);
            auVar130._16_4_ =
                 (uint)bVar67 * ((uint)bVar8 * auVar80._16_4_ | !bVar8 * uVar137) |
                 !bVar67 * auVar130._16_4_;
            bVar67 = (bool)((byte)(uVar63 >> 5) & 1);
            auVar130._20_4_ =
                 (uint)bVar67 * ((uint)bVar9 * auVar80._20_4_ | !bVar9 * uVar138) |
                 !bVar67 * auVar130._20_4_;
            bVar67 = (bool)((byte)(uVar63 >> 6) & 1);
            auVar130._24_4_ =
                 (uint)bVar67 * ((uint)bVar10 * auVar80._24_4_ | !bVar10 * uVar139) |
                 !bVar67 * auVar130._24_4_;
            bVar67 = SUB81(uVar63 >> 7,0);
            auVar130._28_4_ =
                 (uint)bVar67 * ((uint)bVar11 * auVar80._28_4_ | !bVar11 * uVar140) |
                 !bVar67 * auVar130._28_4_;
            bVar62 = (~bVar61 | bVar57) & bVar62;
          }
        }
        auVar250._0_4_ = local_5e0._0_4_ * auVar245._0_4_;
        auVar250._4_4_ = local_5e0._4_4_ * auVar245._4_4_;
        auVar250._8_4_ = local_5e0._8_4_ * auVar245._8_4_;
        auVar250._12_4_ = local_5e0._12_4_ * auVar245._12_4_;
        auVar250._16_4_ = local_5e0._16_4_ * auVar245._16_4_;
        auVar250._20_4_ = local_5e0._20_4_ * auVar245._20_4_;
        auVar250._28_36_ = auVar245._28_36_;
        auVar250._24_4_ = local_5e0._24_4_ * auVar245._24_4_;
        auVar263 = ZEXT3264(local_5c0);
        auVar71 = vfmadd231ps_fma(auVar250._0_32_,local_5c0,auVar95);
        auVar250 = ZEXT3264(local_5a0);
        auVar71 = vfmadd231ps_fma(ZEXT1632(auVar71),local_5a0,auVar101);
        auVar244._8_4_ = 0x7fffffff;
        auVar244._0_8_ = 0x7fffffff7fffffff;
        auVar244._12_4_ = 0x7fffffff;
        auVar244._16_4_ = 0x7fffffff;
        auVar244._20_4_ = 0x7fffffff;
        auVar244._24_4_ = 0x7fffffff;
        auVar244._28_4_ = 0x7fffffff;
        auVar245 = ZEXT3264(auVar244);
        auVar80 = vandps_avx(ZEXT1632(auVar71),auVar244);
        auVar259 = ZEXT3264(auVar81);
        _local_1c0 = auVar81;
        auVar241._8_4_ = 0x3e99999a;
        auVar241._0_8_ = 0x3e99999a3e99999a;
        auVar241._12_4_ = 0x3e99999a;
        auVar241._16_4_ = 0x3e99999a;
        auVar241._20_4_ = 0x3e99999a;
        auVar241._24_4_ = 0x3e99999a;
        auVar241._28_4_ = 0x3e99999a;
        uVar16 = vcmpps_avx512vl(auVar80,auVar241,1);
        _local_560 = vmaxps_avx(auVar81,auVar130);
        _local_360 = _local_560;
        auVar80 = vminps_avx(local_340,auVar129);
        uVar18 = vcmpps_avx512vl(auVar81,auVar80,2);
        bVar61 = (byte)uVar18 & bVar56;
        uVar17 = vcmpps_avx512vl(_local_560,local_340,2);
        if ((bVar56 & ((byte)uVar17 | (byte)uVar18)) == 0) {
          auVar80 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        }
        else {
          bVar57 = (byte)uVar16 | ~bVar62;
          auVar49._4_4_ = local_5e0._4_4_ * auVar257._4_4_;
          auVar49._0_4_ = local_5e0._0_4_ * auVar257._0_4_;
          auVar49._8_4_ = local_5e0._8_4_ * auVar257._8_4_;
          auVar49._12_4_ = local_5e0._12_4_ * auVar257._12_4_;
          auVar49._16_4_ = local_5e0._16_4_ * auVar257._16_4_;
          auVar49._20_4_ = local_5e0._20_4_ * auVar257._20_4_;
          auVar49._24_4_ = local_5e0._24_4_ * auVar257._24_4_;
          auVar49._28_4_ = auVar80._28_4_;
          auVar71 = vfmadd213ps_fma(auVar102,local_5c0,auVar49);
          auVar71 = vfmadd213ps_fma(auVar94,local_5a0,ZEXT1632(auVar71));
          auVar80 = vandps_avx(ZEXT1632(auVar71),auVar244);
          uVar16 = vcmpps_avx512vl(auVar80,auVar241,1);
          bVar62 = (byte)uVar16 | ~bVar62;
          auVar153._8_4_ = 2;
          auVar153._0_8_ = 0x200000002;
          auVar153._12_4_ = 2;
          auVar153._16_4_ = 2;
          auVar153._20_4_ = 2;
          auVar153._24_4_ = 2;
          auVar153._28_4_ = 2;
          auVar29._8_4_ = 3;
          auVar29._0_8_ = 0x300000003;
          auVar29._12_4_ = 3;
          auVar29._16_4_ = 3;
          auVar29._20_4_ = 3;
          auVar29._24_4_ = 3;
          auVar29._28_4_ = 3;
          auVar80 = vpblendmd_avx512vl(auVar153,auVar29);
          local_320._0_4_ = (uint)(bVar62 & 1) * auVar80._0_4_ | (uint)!(bool)(bVar62 & 1) * 2;
          bVar67 = (bool)(bVar62 >> 1 & 1);
          local_320._4_4_ = (uint)bVar67 * auVar80._4_4_ | (uint)!bVar67 * 2;
          bVar67 = (bool)(bVar62 >> 2 & 1);
          local_320._8_4_ = (uint)bVar67 * auVar80._8_4_ | (uint)!bVar67 * 2;
          bVar67 = (bool)(bVar62 >> 3 & 1);
          local_320._12_4_ = (uint)bVar67 * auVar80._12_4_ | (uint)!bVar67 * 2;
          bVar67 = (bool)(bVar62 >> 4 & 1);
          local_320._16_4_ = (uint)bVar67 * auVar80._16_4_ | (uint)!bVar67 * 2;
          bVar67 = (bool)(bVar62 >> 5 & 1);
          local_320._20_4_ = (uint)bVar67 * auVar80._20_4_ | (uint)!bVar67 * 2;
          bVar67 = (bool)(bVar62 >> 6 & 1);
          local_320._24_4_ = (uint)bVar67 * auVar80._24_4_ | (uint)!bVar67 * 2;
          local_320._28_4_ = (uint)(bVar62 >> 7) * auVar80._28_4_ | (uint)!(bool)(bVar62 >> 7) * 2;
          local_4e0 = vpbroadcastd_avx512vl();
          uVar16 = vpcmpd_avx512vl(local_4e0,local_320,5);
          local_540 = auVar81._0_4_ + (float)local_580._0_4_;
          fStack_53c = auVar81._4_4_ + (float)local_580._4_4_;
          fStack_538 = auVar81._8_4_ + fStack_578;
          fStack_534 = auVar81._12_4_ + fStack_574;
          fStack_530 = auVar81._16_4_ + fStack_570;
          fStack_52c = auVar81._20_4_ + fStack_56c;
          fStack_528 = auVar81._24_4_ + fStack_568;
          fStack_524 = auVar81._28_4_ + fStack_564;
          for (bVar62 = (byte)uVar16 & bVar61; auVar80 = _local_360, bVar62 != 0;
              bVar62 = ~bVar64 & bVar62 & (byte)uVar16) {
            auVar154._8_4_ = 0x7f800000;
            auVar154._0_8_ = 0x7f8000007f800000;
            auVar154._12_4_ = 0x7f800000;
            auVar154._16_4_ = 0x7f800000;
            auVar154._20_4_ = 0x7f800000;
            auVar154._24_4_ = 0x7f800000;
            auVar154._28_4_ = 0x7f800000;
            auVar80 = vblendmps_avx512vl(auVar154,auVar81);
            auVar131._0_4_ =
                 (uint)(bVar62 & 1) * auVar80._0_4_ | (uint)!(bool)(bVar62 & 1) * 0x7f800000;
            bVar67 = (bool)(bVar62 >> 1 & 1);
            auVar131._4_4_ = (uint)bVar67 * auVar80._4_4_ | (uint)!bVar67 * 0x7f800000;
            bVar67 = (bool)(bVar62 >> 2 & 1);
            auVar131._8_4_ = (uint)bVar67 * auVar80._8_4_ | (uint)!bVar67 * 0x7f800000;
            bVar67 = (bool)(bVar62 >> 3 & 1);
            auVar131._12_4_ = (uint)bVar67 * auVar80._12_4_ | (uint)!bVar67 * 0x7f800000;
            bVar67 = (bool)(bVar62 >> 4 & 1);
            auVar131._16_4_ = (uint)bVar67 * auVar80._16_4_ | (uint)!bVar67 * 0x7f800000;
            bVar67 = (bool)(bVar62 >> 5 & 1);
            auVar131._20_4_ = (uint)bVar67 * auVar80._20_4_ | (uint)!bVar67 * 0x7f800000;
            auVar131._24_4_ =
                 (uint)(bVar62 >> 6) * auVar80._24_4_ | (uint)!(bool)(bVar62 >> 6) * 0x7f800000;
            auVar131._28_4_ = 0x7f800000;
            auVar80 = vshufps_avx(auVar131,auVar131,0xb1);
            auVar80 = vminps_avx(auVar131,auVar80);
            auVar95 = vshufpd_avx(auVar80,auVar80,5);
            auVar80 = vminps_avx(auVar80,auVar95);
            auVar95 = vpermpd_avx2(auVar80,0x4e);
            auVar80 = vminps_avx(auVar80,auVar95);
            uVar16 = vcmpps_avx512vl(auVar131,auVar80,0);
            bVar58 = (byte)uVar16 & bVar62;
            bVar64 = bVar62;
            if (bVar58 != 0) {
              bVar64 = bVar58;
            }
            iVar19 = 0;
            for (uVar68 = (uint)bVar64; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x80000000) {
              iVar19 = iVar19 + 1;
            }
            bVar64 = '\x01' << ((byte)iVar19 & 0x1f);
            uVar68 = *(uint *)(local_1e0 + (uint)(iVar19 << 2));
            uVar134 = *(uint *)(local_1c0 + (uint)(iVar19 << 2));
            fVar246 = auVar14._0_4_;
            if ((float)local_7e0._0_4_ < 0.0) {
              auVar250 = ZEXT1664(auVar250._0_16_);
              auVar257 = ZEXT1664(auVar257._0_16_);
              auVar259 = ZEXT1664(auVar259._0_16_);
              auVar263 = ZEXT1664(auVar263._0_16_);
              fVar246 = sqrtf((float)local_7e0._0_4_);
            }
            auVar245 = ZEXT464(uVar134);
            uVar63 = (ulong)bVar64;
            auVar72 = vminps_avx(local_760._0_16_,local_7a0._0_16_);
            auVar71 = vmaxps_avx(local_760._0_16_,local_7a0._0_16_);
            auVar69 = vminps_avx(local_780._0_16_,local_7c0._0_16_);
            auVar1 = vminps_avx(auVar72,auVar69);
            auVar72 = vmaxps_avx(local_780._0_16_,local_7c0._0_16_);
            auVar69 = vmaxps_avx(auVar71,auVar72);
            auVar208._8_4_ = 0x7fffffff;
            auVar208._0_8_ = 0x7fffffff7fffffff;
            auVar208._12_4_ = 0x7fffffff;
            auVar71 = vandps_avx(auVar1,auVar208);
            auVar72 = vandps_avx(auVar69,auVar208);
            auVar71 = vmaxps_avx(auVar71,auVar72);
            auVar72 = vmovshdup_avx(auVar71);
            auVar72 = vmaxss_avx(auVar72,auVar71);
            auVar71 = vshufpd_avx(auVar71,auVar71,1);
            auVar71 = vmaxss_avx(auVar71,auVar72);
            fVar251 = auVar71._0_4_ * 1.9073486e-06;
            local_6e0 = vshufps_avx(auVar69,auVar69,0xff);
            auVar71 = vinsertps_avx(ZEXT416(uVar134),ZEXT416(uVar68),0x10);
            auVar255 = ZEXT1664(auVar71);
            uVar65 = 0;
            while( true ) {
              bVar58 = (byte)uVar63;
              if (uVar65 == 5) break;
              uVar165 = auVar255._0_4_;
              auVar144._4_4_ = uVar165;
              auVar144._0_4_ = uVar165;
              auVar144._8_4_ = uVar165;
              auVar144._12_4_ = uVar165;
              auVar71 = vfmadd132ps_fma(auVar144,ZEXT816(0) << 0x40,local_7d0);
              local_740 = auVar255._0_32_;
              auVar72 = vmovshdup_avx(auVar255._0_16_);
              fVar234 = auVar72._0_4_;
              fVar207 = 1.0 - fVar234;
              fVar253 = fVar207 * fVar207 * fVar207;
              fVar225 = fVar234 * fVar234 * fVar234;
              auVar69 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar253),
                                        ZEXT416((uint)fVar225));
              fVar252 = fVar234 * fVar207;
              auVar226 = ZEXT416((uint)fVar207);
              auVar73 = vfmadd231ss_fma(ZEXT416((uint)(fVar252 * fVar234 * 6.0)),
                                        ZEXT416((uint)(fVar252 * fVar207)),
                                        SUB6416(ZEXT464(0x41400000),0));
              auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar225),
                                       ZEXT416((uint)fVar253));
              auVar70 = vfmadd231ss_fma(ZEXT416((uint)(fVar252 * fVar207 * 6.0)),
                                        SUB6416(ZEXT464(0x41400000),0),
                                        ZEXT416((uint)(fVar252 * fVar234)));
              fVar253 = fVar253 * 0.16666667;
              fVar223 = (auVar69._0_4_ + auVar73._0_4_) * 0.16666667;
              fVar224 = (auVar1._0_4_ + auVar70._0_4_) * 0.16666667;
              fVar225 = fVar225 * 0.16666667;
              auVar183._0_4_ = fVar225 * (float)local_7c0._0_4_;
              auVar183._4_4_ = fVar225 * (float)local_7c0._4_4_;
              auVar183._8_4_ = fVar225 * fStack_7b8;
              auVar183._12_4_ = fVar225 * fStack_7b4;
              auVar227._4_4_ = fVar224;
              auVar227._0_4_ = fVar224;
              auVar227._8_4_ = fVar224;
              auVar227._12_4_ = fVar224;
              auVar69 = vfmadd132ps_fma(auVar227,auVar183,local_780._0_16_);
              auVar184._4_4_ = fVar223;
              auVar184._0_4_ = fVar223;
              auVar184._8_4_ = fVar223;
              auVar184._12_4_ = fVar223;
              auVar69 = vfmadd132ps_fma(auVar184,auVar69,local_7a0._0_16_);
              auVar166._4_4_ = fVar253;
              auVar166._0_4_ = fVar253;
              auVar166._8_4_ = fVar253;
              auVar166._12_4_ = fVar253;
              auVar69 = vfmadd132ps_fma(auVar166,auVar69,local_760._0_16_);
              local_600._0_16_ = auVar69;
              auVar69 = vsubps_avx(auVar71,auVar69);
              auVar71 = vdpps_avx(auVar69,auVar69,0x7f);
              local_800._0_16_ = auVar71;
              if (auVar71._0_4_ < 0.0) {
                auVar245._0_4_ = sqrtf(auVar71._0_4_);
                auVar245._4_60_ = extraout_var;
                auVar71 = auVar245._0_16_;
                uVar63 = extraout_RAX;
              }
              else {
                auVar71 = vsqrtss_avx(auVar71,auVar71);
              }
              local_620._4_4_ = fVar207;
              local_620._0_4_ = fVar207;
              fStack_618 = fVar207;
              fStack_614 = fVar207;
              auVar73 = vfnmsub213ss_fma(auVar72,auVar72,ZEXT416((uint)(fVar252 * 4.0)));
              auVar1 = vfmadd231ss_fma(ZEXT416((uint)(fVar252 * 4.0)),auVar226,auVar226);
              fVar252 = fVar207 * -fVar207 * 0.5;
              fVar253 = auVar73._0_4_ * 0.5;
              fVar223 = auVar1._0_4_ * 0.5;
              fVar224 = fVar234 * fVar234 * 0.5;
              auVar209._0_4_ = fVar224 * (float)local_7c0._0_4_;
              auVar209._4_4_ = fVar224 * (float)local_7c0._4_4_;
              auVar209._8_4_ = fVar224 * fStack_7b8;
              auVar209._12_4_ = fVar224 * fStack_7b4;
              auVar167._4_4_ = fVar223;
              auVar167._0_4_ = fVar223;
              auVar167._8_4_ = fVar223;
              auVar167._12_4_ = fVar223;
              auVar1 = vfmadd132ps_fma(auVar167,auVar209,local_780._0_16_);
              auVar185._4_4_ = fVar253;
              auVar185._0_4_ = fVar253;
              auVar185._8_4_ = fVar253;
              auVar185._12_4_ = fVar253;
              auVar1 = vfmadd132ps_fma(auVar185,auVar1,local_7a0._0_16_);
              auVar260._4_4_ = fVar252;
              auVar260._0_4_ = fVar252;
              auVar260._8_4_ = fVar252;
              auVar260._12_4_ = fVar252;
              auVar1 = vfmadd132ps_fma(auVar260,auVar1,local_760._0_16_);
              local_640._0_16_ = vdpps_avx(auVar1,auVar1,0x7f);
              auVar51._12_4_ = 0;
              auVar51._0_12_ = ZEXT812(0);
              fVar252 = local_640._0_4_;
              auVar73 = vrsqrt14ss_avx512f(auVar51 << 0x20,ZEXT416((uint)fVar252));
              fVar253 = auVar73._0_4_;
              local_660._0_16_ = vrcp14ss_avx512f(auVar51 << 0x20,ZEXT416((uint)fVar252));
              auVar73 = vfnmadd213ss_fma(local_660._0_16_,local_640._0_16_,ZEXT416(0x40000000));
              local_680._0_4_ = auVar73._0_4_;
              uVar68 = auVar71._0_4_;
              if (fVar252 < -fVar252) {
                fVar223 = sqrtf(fVar252);
                auVar71 = ZEXT416(uVar68);
                uVar63 = extraout_RAX_00;
              }
              else {
                auVar73 = vsqrtss_avx(local_640._0_16_,local_640._0_16_);
                fVar223 = auVar73._0_4_;
              }
              fVar252 = fVar253 * 1.5 + fVar252 * -0.5 * fVar253 * fVar253 * fVar253;
              auVar145._0_4_ = auVar1._0_4_ * fVar252;
              auVar145._4_4_ = auVar1._4_4_ * fVar252;
              auVar145._8_4_ = auVar1._8_4_ * fVar252;
              auVar145._12_4_ = auVar1._12_4_ * fVar252;
              auVar73 = vdpps_avx(auVar69,auVar145,0x7f);
              fVar225 = auVar71._0_4_;
              fVar253 = auVar73._0_4_;
              auVar146._0_4_ = fVar253 * fVar253;
              auVar146._4_4_ = auVar73._4_4_ * auVar73._4_4_;
              auVar146._8_4_ = auVar73._8_4_ * auVar73._8_4_;
              auVar146._12_4_ = auVar73._12_4_ * auVar73._12_4_;
              auVar70 = vsubps_avx(local_800._0_16_,auVar146);
              fVar224 = auVar70._0_4_;
              auVar168._4_12_ = ZEXT812(0) << 0x20;
              auVar168._0_4_ = fVar224;
              auVar74 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar168);
              auVar75 = vmulss_avx512f(auVar74,ZEXT416(0x3fc00000));
              auVar76 = vmulss_avx512f(auVar70,ZEXT416(0xbf000000));
              if (fVar224 < 0.0) {
                local_6a0._0_4_ = fVar223;
                local_6c0._0_4_ = auVar75._0_4_;
                local_6d0._4_4_ = fVar252;
                local_6d0._0_4_ = fVar252;
                fStack_6c8 = fVar252;
                fStack_6c4 = fVar252;
                local_6b0 = auVar74;
                fVar224 = sqrtf(fVar224);
                auVar76 = ZEXT416(auVar76._0_4_);
                auVar75 = ZEXT416((uint)local_6c0._0_4_);
                auVar71 = ZEXT416(uVar68);
                uVar63 = extraout_RAX_01;
                auVar74 = local_6b0;
                fVar252 = (float)local_6d0._0_4_;
                fVar207 = (float)local_6d0._4_4_;
                fVar234 = fStack_6c8;
                fVar265 = fStack_6c4;
                fVar223 = (float)local_6a0._0_4_;
              }
              else {
                auVar70 = vsqrtss_avx(auVar70,auVar70);
                fVar224 = auVar70._0_4_;
                fVar207 = fVar252;
                fVar234 = fVar252;
                fVar265 = fVar252;
              }
              auVar263 = ZEXT1664(auVar1);
              auVar259 = ZEXT1664(local_800._0_16_);
              auVar257 = ZEXT1664(auVar69);
              auVar70 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar226,auVar72);
              auVar226 = vfmadd213ss_fma(auVar72,SUB6416(ZEXT464(0xc0000000),0),auVar226);
              auVar79 = local_740._0_16_;
              auVar72 = vshufps_avx(auVar79,auVar79,0x55);
              auVar186._0_4_ = auVar72._0_4_ * (float)local_7c0._0_4_;
              auVar186._4_4_ = auVar72._4_4_ * (float)local_7c0._4_4_;
              auVar186._8_4_ = auVar72._8_4_ * fStack_7b8;
              auVar186._12_4_ = auVar72._12_4_ * fStack_7b4;
              auVar210._0_4_ = auVar226._0_4_;
              auVar210._4_4_ = auVar210._0_4_;
              auVar210._8_4_ = auVar210._0_4_;
              auVar210._12_4_ = auVar210._0_4_;
              auVar72 = vfmadd132ps_fma(auVar210,auVar186,local_780._0_16_);
              auVar169._0_4_ = auVar70._0_4_;
              auVar169._4_4_ = auVar169._0_4_;
              auVar169._8_4_ = auVar169._0_4_;
              auVar169._12_4_ = auVar169._0_4_;
              auVar72 = vfmadd132ps_fma(auVar169,auVar72,local_7a0._0_16_);
              auVar72 = vfmadd132ps_fma(_local_620,auVar72,local_760._0_16_);
              auVar170._0_4_ = auVar72._0_4_ * (float)local_640._0_4_;
              auVar170._4_4_ = auVar72._4_4_ * (float)local_640._0_4_;
              auVar170._8_4_ = auVar72._8_4_ * (float)local_640._0_4_;
              auVar170._12_4_ = auVar72._12_4_ * (float)local_640._0_4_;
              auVar72 = vdpps_avx(auVar1,auVar72,0x7f);
              fVar182 = auVar72._0_4_;
              auVar187._0_4_ = auVar1._0_4_ * fVar182;
              auVar187._4_4_ = auVar1._4_4_ * fVar182;
              auVar187._8_4_ = auVar1._8_4_ * fVar182;
              auVar187._12_4_ = auVar1._12_4_ * fVar182;
              auVar72 = vsubps_avx(auVar170,auVar187);
              fVar182 = (float)local_680._0_4_ * (float)local_660._0_4_;
              auVar226 = vmaxss_avx(ZEXT416((uint)fVar251),
                                    ZEXT416((uint)(local_740._0_4_ * fVar246 * 1.9073486e-06)));
              auVar21._8_4_ = 0x80000000;
              auVar21._0_8_ = 0x8000000080000000;
              auVar21._12_4_ = 0x80000000;
              auVar77 = vxorps_avx512vl(auVar1,auVar21);
              auVar188._0_4_ = fVar252 * auVar72._0_4_ * fVar182;
              auVar188._4_4_ = fVar207 * auVar72._4_4_ * fVar182;
              auVar188._8_4_ = fVar234 * auVar72._8_4_ * fVar182;
              auVar188._12_4_ = fVar265 * auVar72._12_4_ * fVar182;
              auVar72 = vdpps_avx(auVar77,auVar145,0x7f);
              auVar70 = vfmadd213ss_fma(auVar71,ZEXT416((uint)fVar251),auVar226);
              auVar71 = vdpps_avx(auVar69,auVar188,0x7f);
              auVar78 = vfmadd213ss_fma(ZEXT416((uint)(fVar225 + 1.0)),
                                        ZEXT416((uint)(fVar251 / fVar223)),auVar70);
              fVar252 = auVar72._0_4_ + auVar71._0_4_;
              auVar71 = vdpps_avx(local_7d0,auVar145,0x7f);
              auVar72 = vdpps_avx(auVar69,auVar77,0x7f);
              auVar70 = vmulss_avx512f(auVar76,auVar74);
              auVar76 = vaddss_avx512f(auVar75,ZEXT416((uint)(auVar70._0_4_ *
                                                             auVar74._0_4_ * auVar74._0_4_)));
              auVar70 = vdpps_avx(auVar69,local_7d0,0x7f);
              auVar75 = vfnmadd231ss_fma(auVar72,auVar73,ZEXT416((uint)fVar252));
              auVar70 = vfnmadd231ss_fma(auVar70,auVar73,auVar71);
              auVar72 = vpermilps_avx(local_600._0_16_,0xff);
              fVar224 = fVar224 - auVar72._0_4_;
              auVar74 = vshufps_avx(auVar1,auVar1,0xff);
              auVar72 = vfmsub213ss_fma(auVar75,auVar76,auVar74);
              auVar247._8_4_ = 0x80000000;
              auVar247._0_8_ = 0x8000000080000000;
              auVar247._12_4_ = 0x80000000;
              auVar250 = ZEXT1664(auVar247);
              auVar242._0_8_ = auVar72._0_8_ ^ 0x8000000080000000;
              auVar242._8_4_ = auVar72._8_4_ ^ 0x80000000;
              auVar242._12_4_ = auVar72._12_4_ ^ 0x80000000;
              auVar245 = ZEXT1664(auVar242);
              auVar70 = ZEXT416((uint)(auVar70._0_4_ * auVar76._0_4_));
              auVar75 = vfmsub231ss_fma(ZEXT416((uint)(auVar71._0_4_ * auVar72._0_4_)),
                                        ZEXT416((uint)fVar252),auVar70);
              auVar72 = vinsertps_avx(auVar242,auVar70,0x1c);
              auVar235._0_8_ = auVar71._0_8_ ^ 0x8000000080000000;
              auVar235._8_4_ = auVar71._8_4_ ^ 0x80000000;
              auVar235._12_4_ = auVar71._12_4_ ^ 0x80000000;
              auVar70 = vinsertps_avx(ZEXT416((uint)fVar252),auVar235,0x10);
              auVar211._0_4_ = auVar75._0_4_;
              auVar211._4_4_ = auVar211._0_4_;
              auVar211._8_4_ = auVar211._0_4_;
              auVar211._12_4_ = auVar211._0_4_;
              auVar71 = vdivps_avx(auVar72,auVar211);
              auVar72 = vdivps_avx(auVar70,auVar211);
              auVar212._0_4_ = fVar253 * auVar71._0_4_ + fVar224 * auVar72._0_4_;
              auVar212._4_4_ = fVar253 * auVar71._4_4_ + fVar224 * auVar72._4_4_;
              auVar212._8_4_ = fVar253 * auVar71._8_4_ + fVar224 * auVar72._8_4_;
              auVar212._12_4_ = fVar253 * auVar71._12_4_ + fVar224 * auVar72._12_4_;
              auVar71 = vsubps_avx(auVar79,auVar212);
              auVar255 = ZEXT1664(auVar71);
              auVar22._8_4_ = 0x7fffffff;
              auVar22._0_8_ = 0x7fffffff7fffffff;
              auVar22._12_4_ = 0x7fffffff;
              auVar72 = vandps_avx512vl(auVar73,auVar22);
              if (auVar72._0_4_ < auVar78._0_4_) {
                auVar72 = vfmadd231ss_fma(ZEXT416((uint)(auVar78._0_4_ + auVar226._0_4_)),local_6e0,
                                          ZEXT416(0x36000000));
                auVar23._8_4_ = 0x7fffffff;
                auVar23._0_8_ = 0x7fffffff7fffffff;
                auVar23._12_4_ = 0x7fffffff;
                auVar73 = vandps_avx512vl(ZEXT416((uint)fVar224),auVar23);
                if (auVar73._0_4_ < auVar72._0_4_) {
                  bVar67 = uVar65 < 5;
                  fVar246 = auVar71._0_4_ + (float)local_6f0._0_4_;
                  if ((fVar141 <= fVar246) &&
                     (fVar251 = *(float *)(ray + k * 4 + 0x100), fVar246 <= fVar251)) {
                    auVar72 = vmovshdup_avx(auVar71);
                    bVar58 = 0;
                    if ((auVar72._0_4_ < 0.0) || (1.0 < auVar72._0_4_)) goto LAB_01aa2cb0;
                    auVar213._0_12_ = ZEXT812(0);
                    auVar213._12_4_ = 0;
                    auVar189._4_8_ = auVar213._4_8_;
                    auVar189._0_4_ = local_800._0_4_;
                    auVar189._12_4_ = 0;
                    auVar72 = vrsqrt14ss_avx512f(auVar213,auVar189);
                    fVar252 = auVar72._0_4_;
                    pGVar3 = (context->scene->geometries).items[uVar2].ptr;
                    if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (bVar58 = 1, pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0))
                      goto LAB_01aa2cb0;
                      fVar252 = fVar252 * 1.5 + local_800._0_4_ * -0.5 * fVar252 * fVar252 * fVar252
                      ;
                      auVar190._0_4_ = auVar69._0_4_ * fVar252;
                      auVar190._4_4_ = auVar69._4_4_ * fVar252;
                      auVar190._8_4_ = auVar69._8_4_ * fVar252;
                      auVar190._12_4_ = auVar69._12_4_ * fVar252;
                      auVar226 = vfmadd213ps_fma(auVar74,auVar190,auVar1);
                      auVar72 = vshufps_avx(auVar190,auVar190,0xc9);
                      auVar73 = vshufps_avx(auVar1,auVar1,0xc9);
                      auVar191._0_4_ = auVar190._0_4_ * auVar73._0_4_;
                      auVar191._4_4_ = auVar190._4_4_ * auVar73._4_4_;
                      auVar191._8_4_ = auVar190._8_4_ * auVar73._8_4_;
                      auVar191._12_4_ = auVar190._12_4_ * auVar73._12_4_;
                      auVar70 = vfmsub231ps_fma(auVar191,auVar1,auVar72);
                      auVar72 = vshufps_avx(auVar70,auVar70,0xc9);
                      auVar73 = vshufps_avx(auVar226,auVar226,0xc9);
                      auVar70 = vshufps_avx(auVar70,auVar70,0xd2);
                      auVar147._0_4_ = auVar226._0_4_ * auVar70._0_4_;
                      auVar147._4_4_ = auVar226._4_4_ * auVar70._4_4_;
                      auVar147._8_4_ = auVar226._8_4_ * auVar70._8_4_;
                      auVar147._12_4_ = auVar226._12_4_ * auVar70._12_4_;
                      auVar72 = vfmsub231ps_fma(auVar147,auVar72,auVar73);
                      auVar220._8_4_ = 1;
                      auVar220._0_8_ = 0x100000001;
                      auVar220._12_4_ = 1;
                      auVar220._16_4_ = 1;
                      auVar220._20_4_ = 1;
                      auVar220._24_4_ = 1;
                      auVar220._28_4_ = 1;
                      local_420 = vpermps_avx2(auVar220,ZEXT1632(auVar71));
                      auVar80 = vpermps_avx2(auVar220,ZEXT1632(auVar72));
                      auVar232._8_4_ = 2;
                      auVar232._0_8_ = 0x200000002;
                      auVar232._12_4_ = 2;
                      auVar232._16_4_ = 2;
                      auVar232._20_4_ = 2;
                      auVar232._24_4_ = 2;
                      auVar232._28_4_ = 2;
                      local_460 = vpermps_avx2(auVar232,ZEXT1632(auVar72));
                      local_440 = auVar72._0_4_;
                      local_480[0] = (RTCHitN)auVar80[0];
                      local_480[1] = (RTCHitN)auVar80[1];
                      local_480[2] = (RTCHitN)auVar80[2];
                      local_480[3] = (RTCHitN)auVar80[3];
                      local_480[4] = (RTCHitN)auVar80[4];
                      local_480[5] = (RTCHitN)auVar80[5];
                      local_480[6] = (RTCHitN)auVar80[6];
                      local_480[7] = (RTCHitN)auVar80[7];
                      local_480[8] = (RTCHitN)auVar80[8];
                      local_480[9] = (RTCHitN)auVar80[9];
                      local_480[10] = (RTCHitN)auVar80[10];
                      local_480[0xb] = (RTCHitN)auVar80[0xb];
                      local_480[0xc] = (RTCHitN)auVar80[0xc];
                      local_480[0xd] = (RTCHitN)auVar80[0xd];
                      local_480[0xe] = (RTCHitN)auVar80[0xe];
                      local_480[0xf] = (RTCHitN)auVar80[0xf];
                      local_480[0x10] = (RTCHitN)auVar80[0x10];
                      local_480[0x11] = (RTCHitN)auVar80[0x11];
                      local_480[0x12] = (RTCHitN)auVar80[0x12];
                      local_480[0x13] = (RTCHitN)auVar80[0x13];
                      local_480[0x14] = (RTCHitN)auVar80[0x14];
                      local_480[0x15] = (RTCHitN)auVar80[0x15];
                      local_480[0x16] = (RTCHitN)auVar80[0x16];
                      local_480[0x17] = (RTCHitN)auVar80[0x17];
                      local_480[0x18] = (RTCHitN)auVar80[0x18];
                      local_480[0x19] = (RTCHitN)auVar80[0x19];
                      local_480[0x1a] = (RTCHitN)auVar80[0x1a];
                      local_480[0x1b] = (RTCHitN)auVar80[0x1b];
                      local_480[0x1c] = (RTCHitN)auVar80[0x1c];
                      local_480[0x1d] = (RTCHitN)auVar80[0x1d];
                      local_480[0x1e] = (RTCHitN)auVar80[0x1e];
                      local_480[0x1f] = (RTCHitN)auVar80[0x1f];
                      uStack_43c = local_440;
                      uStack_438 = local_440;
                      uStack_434 = local_440;
                      uStack_430 = local_440;
                      uStack_42c = local_440;
                      uStack_428 = local_440;
                      uStack_424 = local_440;
                      local_400 = ZEXT432(0) << 0x20;
                      local_3e0 = local_4a0._0_8_;
                      uStack_3d8 = local_4a0._8_8_;
                      uStack_3d0 = local_4a0._16_8_;
                      uStack_3c8 = local_4a0._24_8_;
                      local_3c0 = local_4c0;
                      vpcmpeqd_avx2(local_4c0,local_4c0);
                      local_3a0 = context->user->instID[0];
                      uStack_39c = local_3a0;
                      uStack_398 = local_3a0;
                      uStack_394 = local_3a0;
                      uStack_390 = local_3a0;
                      uStack_38c = local_3a0;
                      uStack_388 = local_3a0;
                      uStack_384 = local_3a0;
                      local_380 = context->user->instPrimID[0];
                      uStack_37c = local_380;
                      uStack_378 = local_380;
                      uStack_374 = local_380;
                      uStack_370 = local_380;
                      uStack_36c = local_380;
                      uStack_368 = local_380;
                      uStack_364 = local_380;
                      *(float *)(ray + k * 4 + 0x100) = fVar246;
                      local_720 = local_500;
                      local_830.valid = (int *)local_720;
                      local_830.geometryUserPtr = pGVar3->userPtr;
                      local_830.context = context->user;
                      local_830.hit = local_480;
                      local_830.N = 8;
                      local_830.ray = (RTCRayN *)ray;
                      if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar245 = ZEXT1664(auVar242);
                        auVar250 = ZEXT1664(auVar247);
                        auVar255 = ZEXT1664(auVar71);
                        auVar257 = ZEXT1664(auVar69);
                        auVar259 = ZEXT1664(local_800._0_16_);
                        auVar263 = ZEXT1664(auVar1);
                        (*pGVar3->occlusionFilterN)(&local_830);
                      }
                      if (local_720 != (undefined1  [32])0x0) {
                        p_Var4 = context->args->filter;
                        if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar245 = ZEXT1664(auVar245._0_16_);
                          auVar250 = ZEXT1664(auVar250._0_16_);
                          auVar255 = ZEXT1664(auVar255._0_16_);
                          auVar257 = ZEXT1664(auVar257._0_16_);
                          auVar259 = ZEXT1664(auVar259._0_16_);
                          auVar263 = ZEXT1664(auVar263._0_16_);
                          (*p_Var4)(&local_830);
                        }
                        uVar63 = vptestmd_avx512vl(local_720,local_720);
                        auVar80 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                        bVar5 = (bool)((byte)uVar63 & 1);
                        bVar6 = (bool)((byte)(uVar63 >> 1) & 1);
                        bVar7 = (bool)((byte)(uVar63 >> 2) & 1);
                        bVar8 = (bool)((byte)(uVar63 >> 3) & 1);
                        bVar9 = (bool)((byte)(uVar63 >> 4) & 1);
                        bVar10 = (bool)((byte)(uVar63 >> 5) & 1);
                        bVar11 = (bool)((byte)(uVar63 >> 6) & 1);
                        bVar12 = SUB81(uVar63 >> 7,0);
                        *(uint *)(local_830.ray + 0x100) =
                             (uint)bVar5 * auVar80._0_4_ |
                             (uint)!bVar5 * *(int *)(local_830.ray + 0x100);
                        *(uint *)(local_830.ray + 0x104) =
                             (uint)bVar6 * auVar80._4_4_ |
                             (uint)!bVar6 * *(int *)(local_830.ray + 0x104);
                        *(uint *)(local_830.ray + 0x108) =
                             (uint)bVar7 * auVar80._8_4_ |
                             (uint)!bVar7 * *(int *)(local_830.ray + 0x108);
                        *(uint *)(local_830.ray + 0x10c) =
                             (uint)bVar8 * auVar80._12_4_ |
                             (uint)!bVar8 * *(int *)(local_830.ray + 0x10c);
                        *(uint *)(local_830.ray + 0x110) =
                             (uint)bVar9 * auVar80._16_4_ |
                             (uint)!bVar9 * *(int *)(local_830.ray + 0x110);
                        *(uint *)(local_830.ray + 0x114) =
                             (uint)bVar10 * auVar80._20_4_ |
                             (uint)!bVar10 * *(int *)(local_830.ray + 0x114);
                        *(uint *)(local_830.ray + 0x118) =
                             (uint)bVar11 * auVar80._24_4_ |
                             (uint)!bVar11 * *(int *)(local_830.ray + 0x118);
                        *(uint *)(local_830.ray + 0x11c) =
                             (uint)bVar12 * auVar80._28_4_ |
                             (uint)!bVar12 * *(int *)(local_830.ray + 0x11c);
                        bVar58 = 1;
                        if (local_720 != (undefined1  [32])0x0) goto LAB_01aa2cb0;
                      }
                      *(float *)(ray + k * 4 + 0x100) = fVar251;
                      bVar58 = 0;
                      goto LAB_01aa2cb0;
                    }
                  }
                  bVar58 = 0;
                  goto LAB_01aa2cb0;
                }
              }
              uVar65 = uVar65 + 1;
            }
            bVar67 = false;
LAB_01aa2cb0:
            bVar59 = bVar59 | bVar67 & bVar58;
            uVar165 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar237._4_4_ = uVar165;
            auVar237._0_4_ = uVar165;
            auVar237._8_4_ = uVar165;
            auVar237._12_4_ = uVar165;
            auVar237._16_4_ = uVar165;
            auVar237._20_4_ = uVar165;
            auVar237._24_4_ = uVar165;
            auVar237._28_4_ = uVar165;
            auVar239 = ZEXT3264(auVar237);
            auVar53._4_4_ = fStack_53c;
            auVar53._0_4_ = local_540;
            auVar53._8_4_ = fStack_538;
            auVar53._12_4_ = fStack_534;
            auVar53._16_4_ = fStack_530;
            auVar53._20_4_ = fStack_52c;
            auVar53._24_4_ = fStack_528;
            auVar53._28_4_ = fStack_524;
            uVar16 = vcmpps_avx512vl(auVar237,auVar53,0xd);
          }
          auVar155._0_4_ = (float)local_580._0_4_ + (float)local_560._0_4_;
          auVar155._4_4_ = (float)local_580._4_4_ + (float)local_560._4_4_;
          auVar155._8_4_ = fStack_578 + fStack_558;
          auVar155._12_4_ = fStack_574 + fStack_554;
          auVar155._16_4_ = fStack_570 + fStack_550;
          auVar155._20_4_ = fStack_56c + fStack_54c;
          auVar155._24_4_ = fStack_568 + fStack_548;
          auVar155._28_4_ = fStack_564 + fStack_544;
          uVar165 = auVar239._0_4_;
          auVar177._4_4_ = uVar165;
          auVar177._0_4_ = uVar165;
          auVar177._8_4_ = uVar165;
          auVar177._12_4_ = uVar165;
          auVar177._16_4_ = uVar165;
          auVar177._20_4_ = uVar165;
          auVar177._24_4_ = uVar165;
          auVar177._28_4_ = uVar165;
          uVar16 = vcmpps_avx512vl(auVar155,auVar177,2);
          auVar156._8_4_ = 2;
          auVar156._0_8_ = 0x200000002;
          auVar156._12_4_ = 2;
          auVar156._16_4_ = 2;
          auVar156._20_4_ = 2;
          auVar156._24_4_ = 2;
          auVar156._28_4_ = 2;
          auVar30._8_4_ = 3;
          auVar30._0_8_ = 0x300000003;
          auVar30._12_4_ = 3;
          auVar30._16_4_ = 3;
          auVar30._20_4_ = 3;
          auVar30._24_4_ = 3;
          auVar30._28_4_ = 3;
          auVar81 = vpblendmd_avx512vl(auVar156,auVar30);
          local_560._0_4_ = (uint)(bVar57 & 1) * auVar81._0_4_ | (uint)!(bool)(bVar57 & 1) * 2;
          bVar67 = (bool)(bVar57 >> 1 & 1);
          local_560._4_4_ = (uint)bVar67 * auVar81._4_4_ | (uint)!bVar67 * 2;
          bVar67 = (bool)(bVar57 >> 2 & 1);
          fStack_558 = (float)((uint)bVar67 * auVar81._8_4_ | (uint)!bVar67 * 2);
          bVar67 = (bool)(bVar57 >> 3 & 1);
          fStack_554 = (float)((uint)bVar67 * auVar81._12_4_ | (uint)!bVar67 * 2);
          bVar67 = (bool)(bVar57 >> 4 & 1);
          fStack_550 = (float)((uint)bVar67 * auVar81._16_4_ | (uint)!bVar67 * 2);
          bVar67 = (bool)(bVar57 >> 5 & 1);
          fStack_54c = (float)((uint)bVar67 * auVar81._20_4_ | (uint)!bVar67 * 2);
          bVar67 = (bool)(bVar57 >> 6 & 1);
          fStack_548 = (float)((uint)bVar67 * auVar81._24_4_ | (uint)!bVar67 * 2);
          fStack_544 = (float)((uint)(bVar57 >> 7) * auVar81._28_4_ | (uint)!(bool)(bVar57 >> 7) * 2
                              );
          bVar56 = (byte)uVar17 & bVar56 & (byte)uVar16;
          uVar16 = vpcmpd_avx512vl(_local_560,local_4e0,2);
          local_540 = (float)local_580._0_4_ + (float)local_360._0_4_;
          fStack_53c = (float)local_580._4_4_ + (float)local_360._4_4_;
          fStack_538 = fStack_578 + fStack_358;
          fStack_534 = fStack_574 + fStack_354;
          fStack_530 = fStack_570 + fStack_350;
          fStack_52c = fStack_56c + fStack_34c;
          fStack_528 = fStack_568 + fStack_348;
          fStack_524 = fStack_564 + fStack_344;
          for (bVar62 = (byte)uVar16 & bVar56; bVar62 != 0; bVar62 = ~bVar57 & bVar62 & (byte)uVar16
              ) {
            auVar157._8_4_ = 0x7f800000;
            auVar157._0_8_ = 0x7f8000007f800000;
            auVar157._12_4_ = 0x7f800000;
            auVar157._16_4_ = 0x7f800000;
            auVar157._20_4_ = 0x7f800000;
            auVar157._24_4_ = 0x7f800000;
            auVar157._28_4_ = 0x7f800000;
            auVar81 = vblendmps_avx512vl(auVar157,auVar80);
            auVar132._0_4_ =
                 (uint)(bVar62 & 1) * auVar81._0_4_ | (uint)!(bool)(bVar62 & 1) * 0x7f800000;
            bVar67 = (bool)(bVar62 >> 1 & 1);
            auVar132._4_4_ = (uint)bVar67 * auVar81._4_4_ | (uint)!bVar67 * 0x7f800000;
            bVar67 = (bool)(bVar62 >> 2 & 1);
            auVar132._8_4_ = (uint)bVar67 * auVar81._8_4_ | (uint)!bVar67 * 0x7f800000;
            bVar67 = (bool)(bVar62 >> 3 & 1);
            auVar132._12_4_ = (uint)bVar67 * auVar81._12_4_ | (uint)!bVar67 * 0x7f800000;
            bVar67 = (bool)(bVar62 >> 4 & 1);
            auVar132._16_4_ = (uint)bVar67 * auVar81._16_4_ | (uint)!bVar67 * 0x7f800000;
            bVar67 = (bool)(bVar62 >> 5 & 1);
            auVar132._20_4_ = (uint)bVar67 * auVar81._20_4_ | (uint)!bVar67 * 0x7f800000;
            auVar132._24_4_ =
                 (uint)(bVar62 >> 6) * auVar81._24_4_ | (uint)!(bool)(bVar62 >> 6) * 0x7f800000;
            auVar132._28_4_ = 0x7f800000;
            auVar81 = vshufps_avx(auVar132,auVar132,0xb1);
            auVar81 = vminps_avx(auVar132,auVar81);
            auVar95 = vshufpd_avx(auVar81,auVar81,5);
            auVar81 = vminps_avx(auVar81,auVar95);
            auVar95 = vpermpd_avx2(auVar81,0x4e);
            auVar81 = vminps_avx(auVar81,auVar95);
            uVar16 = vcmpps_avx512vl(auVar132,auVar81,0);
            bVar64 = (byte)uVar16 & bVar62;
            bVar57 = bVar62;
            if (bVar64 != 0) {
              bVar57 = bVar64;
            }
            iVar19 = 0;
            for (uVar68 = (uint)bVar57; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x80000000) {
              iVar19 = iVar19 + 1;
            }
            bVar57 = '\x01' << ((byte)iVar19 & 0x1f);
            uVar68 = *(uint *)(local_200 + (uint)(iVar19 << 2));
            uVar134 = *(uint *)(local_340 + (uint)(iVar19 << 2));
            fVar246 = auVar13._0_4_;
            if ((float)local_7e0._0_4_ < 0.0) {
              auVar250 = ZEXT1664(auVar250._0_16_);
              auVar257 = ZEXT1664(auVar257._0_16_);
              auVar259 = ZEXT1664(auVar259._0_16_);
              auVar263 = ZEXT1664(auVar263._0_16_);
              fVar246 = sqrtf((float)local_7e0._0_4_);
            }
            auVar245 = ZEXT464(uVar134);
            uVar63 = (ulong)bVar57;
            auVar72 = vminps_avx(local_760._0_16_,local_7a0._0_16_);
            auVar71 = vmaxps_avx(local_760._0_16_,local_7a0._0_16_);
            auVar69 = vminps_avx(local_780._0_16_,local_7c0._0_16_);
            auVar1 = vminps_avx(auVar72,auVar69);
            auVar72 = vmaxps_avx(local_780._0_16_,local_7c0._0_16_);
            auVar69 = vmaxps_avx(auVar71,auVar72);
            auVar214._8_4_ = 0x7fffffff;
            auVar214._0_8_ = 0x7fffffff7fffffff;
            auVar214._12_4_ = 0x7fffffff;
            auVar71 = vandps_avx(auVar1,auVar214);
            auVar72 = vandps_avx(auVar69,auVar214);
            auVar71 = vmaxps_avx(auVar71,auVar72);
            auVar72 = vmovshdup_avx(auVar71);
            auVar72 = vmaxss_avx(auVar72,auVar71);
            auVar71 = vshufpd_avx(auVar71,auVar71,1);
            auVar71 = vmaxss_avx(auVar71,auVar72);
            fVar251 = auVar71._0_4_ * 1.9073486e-06;
            local_6e0 = vshufps_avx(auVar69,auVar69,0xff);
            auVar71 = vinsertps_avx(ZEXT416(uVar134),ZEXT416(uVar68),0x10);
            auVar255 = ZEXT1664(auVar71);
            uVar65 = 0;
            while( true ) {
              bVar64 = (byte)uVar63;
              if (uVar65 == 5) break;
              uVar165 = auVar255._0_4_;
              auVar148._4_4_ = uVar165;
              auVar148._0_4_ = uVar165;
              auVar148._8_4_ = uVar165;
              auVar148._12_4_ = uVar165;
              auVar71 = vfmadd132ps_fma(auVar148,ZEXT816(0) << 0x40,local_7d0);
              local_740 = auVar255._0_32_;
              auVar72 = vmovshdup_avx(auVar255._0_16_);
              fVar234 = auVar72._0_4_;
              fVar207 = 1.0 - fVar234;
              fVar253 = fVar207 * fVar207 * fVar207;
              fVar225 = fVar234 * fVar234 * fVar234;
              auVar69 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar253),
                                        ZEXT416((uint)fVar225));
              fVar252 = fVar234 * fVar207;
              auVar226 = ZEXT416((uint)fVar207);
              auVar73 = vfmadd231ss_fma(ZEXT416((uint)(fVar252 * fVar234 * 6.0)),
                                        ZEXT416((uint)(fVar252 * fVar207)),
                                        SUB6416(ZEXT464(0x41400000),0));
              auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar225),
                                       ZEXT416((uint)fVar253));
              auVar70 = vfmadd231ss_fma(ZEXT416((uint)(fVar252 * fVar207 * 6.0)),
                                        SUB6416(ZEXT464(0x41400000),0),
                                        ZEXT416((uint)(fVar252 * fVar234)));
              fVar253 = fVar253 * 0.16666667;
              fVar223 = (auVar69._0_4_ + auVar73._0_4_) * 0.16666667;
              fVar224 = (auVar1._0_4_ + auVar70._0_4_) * 0.16666667;
              fVar225 = fVar225 * 0.16666667;
              auVar192._0_4_ = fVar225 * (float)local_7c0._0_4_;
              auVar192._4_4_ = fVar225 * (float)local_7c0._4_4_;
              auVar192._8_4_ = fVar225 * fStack_7b8;
              auVar192._12_4_ = fVar225 * fStack_7b4;
              auVar228._4_4_ = fVar224;
              auVar228._0_4_ = fVar224;
              auVar228._8_4_ = fVar224;
              auVar228._12_4_ = fVar224;
              auVar69 = vfmadd132ps_fma(auVar228,auVar192,local_780._0_16_);
              auVar193._4_4_ = fVar223;
              auVar193._0_4_ = fVar223;
              auVar193._8_4_ = fVar223;
              auVar193._12_4_ = fVar223;
              auVar69 = vfmadd132ps_fma(auVar193,auVar69,local_7a0._0_16_);
              auVar171._4_4_ = fVar253;
              auVar171._0_4_ = fVar253;
              auVar171._8_4_ = fVar253;
              auVar171._12_4_ = fVar253;
              auVar69 = vfmadd132ps_fma(auVar171,auVar69,local_760._0_16_);
              local_600._0_16_ = auVar69;
              auVar69 = vsubps_avx(auVar71,auVar69);
              auVar71 = vdpps_avx(auVar69,auVar69,0x7f);
              local_800._0_16_ = auVar71;
              if (auVar71._0_4_ < 0.0) {
                auVar255._0_4_ = sqrtf(auVar71._0_4_);
                auVar255._4_60_ = extraout_var_00;
                auVar71 = auVar255._0_16_;
                uVar63 = extraout_RAX_02;
              }
              else {
                auVar71 = vsqrtss_avx(auVar71,auVar71);
              }
              local_620._4_4_ = fVar207;
              local_620._0_4_ = fVar207;
              fStack_618 = fVar207;
              fStack_614 = fVar207;
              auVar73 = vfnmsub213ss_fma(auVar72,auVar72,ZEXT416((uint)(fVar252 * 4.0)));
              auVar1 = vfmadd231ss_fma(ZEXT416((uint)(fVar252 * 4.0)),auVar226,auVar226);
              fVar252 = fVar207 * -fVar207 * 0.5;
              fVar253 = auVar73._0_4_ * 0.5;
              fVar223 = auVar1._0_4_ * 0.5;
              fVar224 = fVar234 * fVar234 * 0.5;
              auVar215._0_4_ = fVar224 * (float)local_7c0._0_4_;
              auVar215._4_4_ = fVar224 * (float)local_7c0._4_4_;
              auVar215._8_4_ = fVar224 * fStack_7b8;
              auVar215._12_4_ = fVar224 * fStack_7b4;
              auVar172._4_4_ = fVar223;
              auVar172._0_4_ = fVar223;
              auVar172._8_4_ = fVar223;
              auVar172._12_4_ = fVar223;
              auVar1 = vfmadd132ps_fma(auVar172,auVar215,local_780._0_16_);
              auVar194._4_4_ = fVar253;
              auVar194._0_4_ = fVar253;
              auVar194._8_4_ = fVar253;
              auVar194._12_4_ = fVar253;
              auVar1 = vfmadd132ps_fma(auVar194,auVar1,local_7a0._0_16_);
              auVar261._4_4_ = fVar252;
              auVar261._0_4_ = fVar252;
              auVar261._8_4_ = fVar252;
              auVar261._12_4_ = fVar252;
              auVar1 = vfmadd132ps_fma(auVar261,auVar1,local_760._0_16_);
              local_640._0_16_ = vdpps_avx(auVar1,auVar1,0x7f);
              auVar52._12_4_ = 0;
              auVar52._0_12_ = ZEXT812(0);
              fVar252 = local_640._0_4_;
              auVar73 = vrsqrt14ss_avx512f(auVar52 << 0x20,ZEXT416((uint)fVar252));
              fVar253 = auVar73._0_4_;
              local_660._0_16_ = vrcp14ss_avx512f(auVar52 << 0x20,ZEXT416((uint)fVar252));
              auVar73 = vfnmadd213ss_fma(local_660._0_16_,local_640._0_16_,ZEXT416(0x40000000));
              local_680._0_4_ = auVar73._0_4_;
              uVar68 = auVar71._0_4_;
              if (fVar252 < -fVar252) {
                fVar223 = sqrtf(fVar252);
                auVar71 = ZEXT416(uVar68);
                uVar63 = extraout_RAX_03;
              }
              else {
                auVar73 = vsqrtss_avx(local_640._0_16_,local_640._0_16_);
                fVar223 = auVar73._0_4_;
              }
              auVar76 = vbroadcastss_avx512vl
                                  (ZEXT416((uint)(fVar253 * 1.5 +
                                                 fVar252 * -0.5 * fVar253 * fVar253 * fVar253)));
              auVar75 = vmulps_avx512vl(auVar1,auVar76);
              auVar73 = vdpps_avx(auVar69,auVar75,0x7f);
              fVar224 = auVar71._0_4_;
              fVar252 = auVar73._0_4_;
              auVar149._0_4_ = fVar252 * fVar252;
              auVar149._4_4_ = auVar73._4_4_ * auVar73._4_4_;
              auVar149._8_4_ = auVar73._8_4_ * auVar73._8_4_;
              auVar149._12_4_ = auVar73._12_4_ * auVar73._12_4_;
              auVar70 = vsubps_avx(local_800._0_16_,auVar149);
              fVar253 = auVar70._0_4_;
              auVar173._4_12_ = ZEXT812(0) << 0x20;
              auVar173._0_4_ = fVar253;
              auVar74 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar173);
              auVar78 = vmulss_avx512f(auVar74,ZEXT416(0x3fc00000));
              auVar77 = vmulss_avx512f(auVar70,ZEXT416(0xbf000000));
              if (fVar253 < 0.0) {
                local_6b0._0_4_ = auVar78._0_4_;
                _local_6d0 = auVar76;
                local_6c0 = auVar75;
                local_6a0 = auVar74;
                fVar253 = sqrtf(fVar253);
                auVar77 = ZEXT416(auVar77._0_4_);
                auVar78 = ZEXT416((uint)local_6b0._0_4_);
                auVar71 = ZEXT416(uVar68);
                uVar63 = extraout_RAX_04;
                auVar74 = local_6a0;
                auVar75 = local_6c0;
                auVar76 = _local_6d0;
              }
              else {
                auVar70 = vsqrtss_avx(auVar70,auVar70);
                fVar253 = auVar70._0_4_;
              }
              auVar263 = ZEXT1664(auVar1);
              auVar259 = ZEXT1664(local_800._0_16_);
              auVar257 = ZEXT1664(auVar69);
              auVar70 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar226,auVar72);
              auVar226 = vfmadd213ss_fma(auVar72,SUB6416(ZEXT464(0xc0000000),0),auVar226);
              auVar254 = local_740._0_16_;
              auVar72 = vshufps_avx(auVar254,auVar254,0x55);
              auVar195._0_4_ = auVar72._0_4_ * (float)local_7c0._0_4_;
              auVar195._4_4_ = auVar72._4_4_ * (float)local_7c0._4_4_;
              auVar195._8_4_ = auVar72._8_4_ * fStack_7b8;
              auVar195._12_4_ = auVar72._12_4_ * fStack_7b4;
              auVar216._0_4_ = auVar226._0_4_;
              auVar216._4_4_ = auVar216._0_4_;
              auVar216._8_4_ = auVar216._0_4_;
              auVar216._12_4_ = auVar216._0_4_;
              auVar72 = vfmadd132ps_fma(auVar216,auVar195,local_780._0_16_);
              auVar174._0_4_ = auVar70._0_4_;
              auVar174._4_4_ = auVar174._0_4_;
              auVar174._8_4_ = auVar174._0_4_;
              auVar174._12_4_ = auVar174._0_4_;
              auVar72 = vfmadd132ps_fma(auVar174,auVar72,local_7a0._0_16_);
              auVar72 = vfmadd132ps_fma(_local_620,auVar72,local_760._0_16_);
              auVar175._0_4_ = auVar72._0_4_ * (float)local_640._0_4_;
              auVar175._4_4_ = auVar72._4_4_ * (float)local_640._0_4_;
              auVar175._8_4_ = auVar72._8_4_ * (float)local_640._0_4_;
              auVar175._12_4_ = auVar72._12_4_ * (float)local_640._0_4_;
              auVar72 = vdpps_avx(auVar1,auVar72,0x7f);
              fVar225 = auVar72._0_4_;
              auVar196._0_4_ = auVar1._0_4_ * fVar225;
              auVar196._4_4_ = auVar1._4_4_ * fVar225;
              auVar196._8_4_ = auVar1._8_4_ * fVar225;
              auVar196._12_4_ = auVar1._12_4_ * fVar225;
              auVar72 = vsubps_avx(auVar175,auVar196);
              fVar225 = (float)local_680._0_4_ * (float)local_660._0_4_;
              auVar226 = vmaxss_avx(ZEXT416((uint)fVar251),
                                    ZEXT416((uint)(local_740._0_4_ * fVar246 * 1.9073486e-06)));
              auVar197._0_4_ = auVar72._0_4_ * fVar225;
              auVar197._4_4_ = auVar72._4_4_ * fVar225;
              auVar197._8_4_ = auVar72._8_4_ * fVar225;
              auVar197._12_4_ = auVar72._12_4_ * fVar225;
              auVar24._8_4_ = 0x80000000;
              auVar24._0_8_ = 0x8000000080000000;
              auVar24._12_4_ = 0x80000000;
              auVar79 = vxorps_avx512vl(auVar1,auVar24);
              auVar76 = vmulps_avx512vl(auVar76,auVar197);
              auVar72 = vdpps_avx(auVar79,auVar75,0x7f);
              auVar70 = vfmadd213ss_fma(auVar71,ZEXT416((uint)fVar251),auVar226);
              auVar71 = vdpps_avx(auVar69,auVar76,0x7f);
              auVar76 = vfmadd213ss_fma(ZEXT416((uint)(fVar224 + 1.0)),
                                        ZEXT416((uint)(fVar251 / fVar223)),auVar70);
              fVar223 = auVar72._0_4_ + auVar71._0_4_;
              auVar71 = vdpps_avx(local_7d0,auVar75,0x7f);
              auVar72 = vdpps_avx(auVar69,auVar79,0x7f);
              auVar70 = vmulss_avx512f(auVar77,auVar74);
              auVar78 = vaddss_avx512f(auVar78,ZEXT416((uint)(auVar70._0_4_ *
                                                             auVar74._0_4_ * auVar74._0_4_)));
              auVar70 = vdpps_avx(auVar69,local_7d0,0x7f);
              auVar75 = vfnmadd231ss_fma(auVar72,auVar73,ZEXT416((uint)fVar223));
              auVar70 = vfnmadd231ss_fma(auVar70,auVar73,auVar71);
              auVar72 = vpermilps_avx(local_600._0_16_,0xff);
              fVar253 = fVar253 - auVar72._0_4_;
              auVar74 = vshufps_avx(auVar1,auVar1,0xff);
              auVar72 = vfmsub213ss_fma(auVar75,auVar78,auVar74);
              auVar248._8_4_ = 0x80000000;
              auVar248._0_8_ = 0x8000000080000000;
              auVar248._12_4_ = 0x80000000;
              auVar250 = ZEXT1664(auVar248);
              auVar243._0_8_ = auVar72._0_8_ ^ 0x8000000080000000;
              auVar243._8_4_ = auVar72._8_4_ ^ 0x80000000;
              auVar243._12_4_ = auVar72._12_4_ ^ 0x80000000;
              auVar245 = ZEXT1664(auVar243);
              auVar70 = ZEXT416((uint)(auVar70._0_4_ * auVar78._0_4_));
              auVar75 = vfmsub231ss_fma(ZEXT416((uint)(auVar71._0_4_ * auVar72._0_4_)),
                                        ZEXT416((uint)fVar223),auVar70);
              auVar72 = vinsertps_avx(auVar243,auVar70,0x1c);
              auVar236._0_8_ = auVar71._0_8_ ^ 0x8000000080000000;
              auVar236._8_4_ = auVar71._8_4_ ^ 0x80000000;
              auVar236._12_4_ = auVar71._12_4_ ^ 0x80000000;
              auVar70 = vinsertps_avx(ZEXT416((uint)fVar223),auVar236,0x10);
              auVar217._0_4_ = auVar75._0_4_;
              auVar217._4_4_ = auVar217._0_4_;
              auVar217._8_4_ = auVar217._0_4_;
              auVar217._12_4_ = auVar217._0_4_;
              auVar71 = vdivps_avx(auVar72,auVar217);
              auVar72 = vdivps_avx(auVar70,auVar217);
              auVar218._0_4_ = fVar252 * auVar71._0_4_ + fVar253 * auVar72._0_4_;
              auVar218._4_4_ = fVar252 * auVar71._4_4_ + fVar253 * auVar72._4_4_;
              auVar218._8_4_ = fVar252 * auVar71._8_4_ + fVar253 * auVar72._8_4_;
              auVar218._12_4_ = fVar252 * auVar71._12_4_ + fVar253 * auVar72._12_4_;
              auVar71 = vsubps_avx(auVar254,auVar218);
              auVar255 = ZEXT1664(auVar71);
              auVar25._8_4_ = 0x7fffffff;
              auVar25._0_8_ = 0x7fffffff7fffffff;
              auVar25._12_4_ = 0x7fffffff;
              auVar72 = vandps_avx512vl(auVar73,auVar25);
              if (auVar72._0_4_ < auVar76._0_4_) {
                auVar72 = vfmadd231ss_fma(ZEXT416((uint)(auVar76._0_4_ + auVar226._0_4_)),local_6e0,
                                          ZEXT416(0x36000000));
                auVar26._8_4_ = 0x7fffffff;
                auVar26._0_8_ = 0x7fffffff7fffffff;
                auVar26._12_4_ = 0x7fffffff;
                auVar73 = vandps_avx512vl(ZEXT416((uint)fVar253),auVar26);
                if (auVar73._0_4_ < auVar72._0_4_) {
                  bVar67 = uVar65 < 5;
                  fVar246 = auVar71._0_4_ + (float)local_6f0._0_4_;
                  if ((fVar141 <= fVar246) &&
                     (fVar251 = *(float *)(ray + k * 4 + 0x100), fVar246 <= fVar251)) {
                    auVar72 = vmovshdup_avx(auVar71);
                    bVar64 = 0;
                    if ((auVar72._0_4_ < 0.0) || (1.0 < auVar72._0_4_)) goto LAB_01aa3926;
                    auVar219._0_12_ = ZEXT812(0);
                    auVar219._12_4_ = 0;
                    auVar198._4_8_ = auVar219._4_8_;
                    auVar198._0_4_ = local_800._0_4_;
                    auVar198._12_4_ = 0;
                    auVar72 = vrsqrt14ss_avx512f(auVar219,auVar198);
                    fVar252 = auVar72._0_4_;
                    pGVar3 = (context->scene->geometries).items[uVar2].ptr;
                    if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (bVar64 = 1, pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0))
                      goto LAB_01aa3926;
                      fVar252 = fVar252 * 1.5 + local_800._0_4_ * -0.5 * fVar252 * fVar252 * fVar252
                      ;
                      auVar199._0_4_ = auVar69._0_4_ * fVar252;
                      auVar199._4_4_ = auVar69._4_4_ * fVar252;
                      auVar199._8_4_ = auVar69._8_4_ * fVar252;
                      auVar199._12_4_ = auVar69._12_4_ * fVar252;
                      auVar226 = vfmadd213ps_fma(auVar74,auVar199,auVar1);
                      auVar72 = vshufps_avx(auVar199,auVar199,0xc9);
                      auVar73 = vshufps_avx(auVar1,auVar1,0xc9);
                      auVar200._0_4_ = auVar199._0_4_ * auVar73._0_4_;
                      auVar200._4_4_ = auVar199._4_4_ * auVar73._4_4_;
                      auVar200._8_4_ = auVar199._8_4_ * auVar73._8_4_;
                      auVar200._12_4_ = auVar199._12_4_ * auVar73._12_4_;
                      auVar70 = vfmsub231ps_fma(auVar200,auVar1,auVar72);
                      auVar72 = vshufps_avx(auVar70,auVar70,0xc9);
                      auVar73 = vshufps_avx(auVar226,auVar226,0xc9);
                      auVar70 = vshufps_avx(auVar70,auVar70,0xd2);
                      auVar150._0_4_ = auVar226._0_4_ * auVar70._0_4_;
                      auVar150._4_4_ = auVar226._4_4_ * auVar70._4_4_;
                      auVar150._8_4_ = auVar226._8_4_ * auVar70._8_4_;
                      auVar150._12_4_ = auVar226._12_4_ * auVar70._12_4_;
                      auVar72 = vfmsub231ps_fma(auVar150,auVar72,auVar73);
                      auVar221._8_4_ = 1;
                      auVar221._0_8_ = 0x100000001;
                      auVar221._12_4_ = 1;
                      auVar221._16_4_ = 1;
                      auVar221._20_4_ = 1;
                      auVar221._24_4_ = 1;
                      auVar221._28_4_ = 1;
                      local_420 = vpermps_avx2(auVar221,ZEXT1632(auVar71));
                      auVar81 = vpermps_avx2(auVar221,ZEXT1632(auVar72));
                      auVar233._8_4_ = 2;
                      auVar233._0_8_ = 0x200000002;
                      auVar233._12_4_ = 2;
                      auVar233._16_4_ = 2;
                      auVar233._20_4_ = 2;
                      auVar233._24_4_ = 2;
                      auVar233._28_4_ = 2;
                      local_460 = vpermps_avx2(auVar233,ZEXT1632(auVar72));
                      local_440 = auVar72._0_4_;
                      local_480[0] = (RTCHitN)auVar81[0];
                      local_480[1] = (RTCHitN)auVar81[1];
                      local_480[2] = (RTCHitN)auVar81[2];
                      local_480[3] = (RTCHitN)auVar81[3];
                      local_480[4] = (RTCHitN)auVar81[4];
                      local_480[5] = (RTCHitN)auVar81[5];
                      local_480[6] = (RTCHitN)auVar81[6];
                      local_480[7] = (RTCHitN)auVar81[7];
                      local_480[8] = (RTCHitN)auVar81[8];
                      local_480[9] = (RTCHitN)auVar81[9];
                      local_480[10] = (RTCHitN)auVar81[10];
                      local_480[0xb] = (RTCHitN)auVar81[0xb];
                      local_480[0xc] = (RTCHitN)auVar81[0xc];
                      local_480[0xd] = (RTCHitN)auVar81[0xd];
                      local_480[0xe] = (RTCHitN)auVar81[0xe];
                      local_480[0xf] = (RTCHitN)auVar81[0xf];
                      local_480[0x10] = (RTCHitN)auVar81[0x10];
                      local_480[0x11] = (RTCHitN)auVar81[0x11];
                      local_480[0x12] = (RTCHitN)auVar81[0x12];
                      local_480[0x13] = (RTCHitN)auVar81[0x13];
                      local_480[0x14] = (RTCHitN)auVar81[0x14];
                      local_480[0x15] = (RTCHitN)auVar81[0x15];
                      local_480[0x16] = (RTCHitN)auVar81[0x16];
                      local_480[0x17] = (RTCHitN)auVar81[0x17];
                      local_480[0x18] = (RTCHitN)auVar81[0x18];
                      local_480[0x19] = (RTCHitN)auVar81[0x19];
                      local_480[0x1a] = (RTCHitN)auVar81[0x1a];
                      local_480[0x1b] = (RTCHitN)auVar81[0x1b];
                      local_480[0x1c] = (RTCHitN)auVar81[0x1c];
                      local_480[0x1d] = (RTCHitN)auVar81[0x1d];
                      local_480[0x1e] = (RTCHitN)auVar81[0x1e];
                      local_480[0x1f] = (RTCHitN)auVar81[0x1f];
                      uStack_43c = local_440;
                      uStack_438 = local_440;
                      uStack_434 = local_440;
                      uStack_430 = local_440;
                      uStack_42c = local_440;
                      uStack_428 = local_440;
                      uStack_424 = local_440;
                      local_400 = ZEXT432(0) << 0x20;
                      local_3e0 = local_4a0._0_8_;
                      uStack_3d8 = local_4a0._8_8_;
                      uStack_3d0 = local_4a0._16_8_;
                      uStack_3c8 = local_4a0._24_8_;
                      local_3c0 = local_4c0;
                      vpcmpeqd_avx2(local_4c0,local_4c0);
                      local_3a0 = context->user->instID[0];
                      uStack_39c = local_3a0;
                      uStack_398 = local_3a0;
                      uStack_394 = local_3a0;
                      uStack_390 = local_3a0;
                      uStack_38c = local_3a0;
                      uStack_388 = local_3a0;
                      uStack_384 = local_3a0;
                      local_380 = context->user->instPrimID[0];
                      uStack_37c = local_380;
                      uStack_378 = local_380;
                      uStack_374 = local_380;
                      uStack_370 = local_380;
                      uStack_36c = local_380;
                      uStack_368 = local_380;
                      uStack_364 = local_380;
                      *(float *)(ray + k * 4 + 0x100) = fVar246;
                      local_720 = local_500;
                      local_830.valid = (int *)local_720;
                      local_830.geometryUserPtr = pGVar3->userPtr;
                      local_830.context = context->user;
                      local_830.hit = local_480;
                      local_830.N = 8;
                      local_830.ray = (RTCRayN *)ray;
                      if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar245 = ZEXT1664(auVar243);
                        auVar250 = ZEXT1664(auVar248);
                        auVar255 = ZEXT1664(auVar71);
                        auVar257 = ZEXT1664(auVar69);
                        auVar259 = ZEXT1664(local_800._0_16_);
                        auVar263 = ZEXT1664(auVar1);
                        (*pGVar3->occlusionFilterN)(&local_830);
                      }
                      if (local_720 != (undefined1  [32])0x0) {
                        p_Var4 = context->args->filter;
                        if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar245 = ZEXT1664(auVar245._0_16_);
                          auVar250 = ZEXT1664(auVar250._0_16_);
                          auVar255 = ZEXT1664(auVar255._0_16_);
                          auVar257 = ZEXT1664(auVar257._0_16_);
                          auVar259 = ZEXT1664(auVar259._0_16_);
                          auVar263 = ZEXT1664(auVar263._0_16_);
                          (*p_Var4)(&local_830);
                        }
                        uVar63 = vptestmd_avx512vl(local_720,local_720);
                        auVar81 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                        bVar5 = (bool)((byte)uVar63 & 1);
                        bVar6 = (bool)((byte)(uVar63 >> 1) & 1);
                        bVar7 = (bool)((byte)(uVar63 >> 2) & 1);
                        bVar8 = (bool)((byte)(uVar63 >> 3) & 1);
                        bVar9 = (bool)((byte)(uVar63 >> 4) & 1);
                        bVar10 = (bool)((byte)(uVar63 >> 5) & 1);
                        bVar11 = (bool)((byte)(uVar63 >> 6) & 1);
                        bVar12 = SUB81(uVar63 >> 7,0);
                        *(uint *)(local_830.ray + 0x100) =
                             (uint)bVar5 * auVar81._0_4_ |
                             (uint)!bVar5 * *(int *)(local_830.ray + 0x100);
                        *(uint *)(local_830.ray + 0x104) =
                             (uint)bVar6 * auVar81._4_4_ |
                             (uint)!bVar6 * *(int *)(local_830.ray + 0x104);
                        *(uint *)(local_830.ray + 0x108) =
                             (uint)bVar7 * auVar81._8_4_ |
                             (uint)!bVar7 * *(int *)(local_830.ray + 0x108);
                        *(uint *)(local_830.ray + 0x10c) =
                             (uint)bVar8 * auVar81._12_4_ |
                             (uint)!bVar8 * *(int *)(local_830.ray + 0x10c);
                        *(uint *)(local_830.ray + 0x110) =
                             (uint)bVar9 * auVar81._16_4_ |
                             (uint)!bVar9 * *(int *)(local_830.ray + 0x110);
                        *(uint *)(local_830.ray + 0x114) =
                             (uint)bVar10 * auVar81._20_4_ |
                             (uint)!bVar10 * *(int *)(local_830.ray + 0x114);
                        *(uint *)(local_830.ray + 0x118) =
                             (uint)bVar11 * auVar81._24_4_ |
                             (uint)!bVar11 * *(int *)(local_830.ray + 0x118);
                        *(uint *)(local_830.ray + 0x11c) =
                             (uint)bVar12 * auVar81._28_4_ |
                             (uint)!bVar12 * *(int *)(local_830.ray + 0x11c);
                        bVar64 = 1;
                        if (local_720 != (undefined1  [32])0x0) goto LAB_01aa3926;
                      }
                      *(float *)(ray + k * 4 + 0x100) = fVar251;
                    }
                  }
                  bVar64 = 0;
                  goto LAB_01aa3926;
                }
              }
              uVar65 = uVar65 + 1;
            }
            bVar67 = false;
LAB_01aa3926:
            bVar59 = bVar59 | bVar67 & bVar64;
            uVar165 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar238._4_4_ = uVar165;
            auVar238._0_4_ = uVar165;
            auVar238._8_4_ = uVar165;
            auVar238._12_4_ = uVar165;
            auVar238._16_4_ = uVar165;
            auVar238._20_4_ = uVar165;
            auVar238._24_4_ = uVar165;
            auVar238._28_4_ = uVar165;
            auVar239 = ZEXT3264(auVar238);
            auVar54._4_4_ = fStack_53c;
            auVar54._0_4_ = local_540;
            auVar54._8_4_ = fStack_538;
            auVar54._12_4_ = fStack_534;
            auVar54._16_4_ = fStack_530;
            auVar54._20_4_ = fStack_52c;
            auVar54._24_4_ = fStack_528;
            auVar54._28_4_ = fStack_524;
            uVar16 = vcmpps_avx512vl(auVar238,auVar54,0xd);
          }
          uVar18 = vpcmpd_avx512vl(local_4e0,local_320,1);
          uVar17 = vpcmpd_avx512vl(local_4e0,_local_560,1);
          auVar178._0_4_ = (float)local_580._0_4_ + (float)local_1c0._0_4_;
          auVar178._4_4_ = (float)local_580._4_4_ + (float)local_1c0._4_4_;
          auVar178._8_4_ = fStack_578 + fStack_1b8;
          auVar178._12_4_ = fStack_574 + fStack_1b4;
          auVar178._16_4_ = fStack_570 + fStack_1b0;
          auVar178._20_4_ = fStack_56c + fStack_1ac;
          auVar178._24_4_ = fStack_568 + fStack_1a8;
          auVar178._28_4_ = fStack_564 + fStack_1a4;
          uVar165 = auVar239._0_4_;
          auVar202._4_4_ = uVar165;
          auVar202._0_4_ = uVar165;
          auVar202._8_4_ = uVar165;
          auVar202._12_4_ = uVar165;
          auVar202._16_4_ = uVar165;
          auVar202._20_4_ = uVar165;
          auVar202._24_4_ = uVar165;
          auVar202._28_4_ = uVar165;
          uVar16 = vcmpps_avx512vl(auVar178,auVar202,2);
          bVar61 = bVar61 & (byte)uVar18 & (byte)uVar16;
          auVar222._0_4_ = (float)local_580._0_4_ + (float)local_360._0_4_;
          auVar222._4_4_ = (float)local_580._4_4_ + (float)local_360._4_4_;
          auVar222._8_4_ = fStack_578 + fStack_358;
          auVar222._12_4_ = fStack_574 + fStack_354;
          auVar222._16_4_ = fStack_570 + fStack_350;
          auVar222._20_4_ = fStack_56c + fStack_34c;
          auVar222._24_4_ = fStack_568 + fStack_348;
          auVar222._28_4_ = fStack_564 + fStack_344;
          uVar16 = vcmpps_avx512vl(auVar222,auVar202,2);
          bVar56 = bVar56 & (byte)uVar17 & (byte)uVar16 | bVar61;
          if (bVar56 != 0) {
            abStack_180[uVar60 * 0x60] = bVar56;
            bVar67 = (bool)(bVar61 >> 1 & 1);
            bVar5 = (bool)(bVar61 >> 2 & 1);
            bVar6 = (bool)(bVar61 >> 3 & 1);
            bVar7 = (bool)(bVar61 >> 4 & 1);
            bVar8 = (bool)(bVar61 >> 5 & 1);
            auStack_160[uVar60 * 0x18] =
                 (uint)(bVar61 & 1) * local_1c0._0_4_ | (uint)!(bool)(bVar61 & 1) * local_360._0_4_;
            auStack_160[uVar60 * 0x18 + 1] =
                 (uint)bVar67 * local_1c0._4_4_ | (uint)!bVar67 * local_360._4_4_;
            auStack_160[uVar60 * 0x18 + 2] =
                 (uint)bVar5 * (int)fStack_1b8 | (uint)!bVar5 * (int)fStack_358;
            auStack_160[uVar60 * 0x18 + 3] =
                 (uint)bVar6 * (int)fStack_1b4 | (uint)!bVar6 * (int)fStack_354;
            auStack_160[uVar60 * 0x18 + 4] =
                 (uint)bVar7 * (int)fStack_1b0 | (uint)!bVar7 * (int)fStack_350;
            auStack_160[uVar60 * 0x18 + 5] =
                 (uint)bVar8 * (int)fStack_1ac | (uint)!bVar8 * (int)fStack_34c;
            auStack_160[uVar60 * 0x18 + 6] =
                 (uint)(bVar61 >> 6) * (int)fStack_1a8 |
                 (uint)!(bool)(bVar61 >> 6) * (int)fStack_348;
            (&fStack_144)[uVar60 * 0x18] = fStack_344;
            uVar63 = vmovlps_avx(local_510);
            (&uStack_140)[uVar60 * 0xc] = uVar63;
            aiStack_138[uVar60 * 0x18] = local_b1c + 1;
            uVar60 = (ulong)((int)uVar60 + 1);
          }
          auVar80 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        }
        auVar267 = ZEXT3264(auVar80);
        auVar239 = ZEXT3264(_DAT_01f7b040);
      }
    }
    do {
      uVar68 = (uint)uVar60;
      uVar60 = (ulong)(uVar68 - 1);
      if (uVar68 == 0) {
        if (bVar59 != 0) goto LAB_01aa3f33;
        uVar165 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar32._4_4_ = uVar165;
        auVar32._0_4_ = uVar165;
        auVar32._8_4_ = uVar165;
        auVar32._12_4_ = uVar165;
        auVar32._16_4_ = uVar165;
        auVar32._20_4_ = uVar165;
        auVar32._24_4_ = uVar165;
        auVar32._28_4_ = uVar165;
        uVar16 = vcmpps_avx512vl(local_300,auVar32,2);
        uVar66 = (ulong)((uint)local_688 & (uint)uVar16);
        goto LAB_01aa14ba;
      }
      auVar80 = *(undefined1 (*) [32])(auStack_160 + uVar60 * 0x18);
      auVar179._0_4_ = auVar80._0_4_ + (float)local_580._0_4_;
      auVar179._4_4_ = auVar80._4_4_ + (float)local_580._4_4_;
      auVar179._8_4_ = auVar80._8_4_ + fStack_578;
      auVar179._12_4_ = auVar80._12_4_ + fStack_574;
      auVar179._16_4_ = auVar80._16_4_ + fStack_570;
      auVar179._20_4_ = auVar80._20_4_ + fStack_56c;
      auVar179._24_4_ = auVar80._24_4_ + fStack_568;
      auVar179._28_4_ = auVar80._28_4_ + fStack_564;
      uVar165 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar31._4_4_ = uVar165;
      auVar31._0_4_ = uVar165;
      auVar31._8_4_ = uVar165;
      auVar31._12_4_ = uVar165;
      auVar31._16_4_ = uVar165;
      auVar31._20_4_ = uVar165;
      auVar31._24_4_ = uVar165;
      auVar31._28_4_ = uVar165;
      uVar16 = vcmpps_avx512vl(auVar179,auVar31,2);
      uVar134 = (uint)uVar16 & (uint)abStack_180[uVar60 * 0x60];
    } while (uVar134 == 0);
    uVar63 = (&uStack_140)[uVar60 * 0xc];
    auVar176._8_8_ = 0;
    auVar176._0_8_ = uVar63;
    auVar203._8_4_ = 0x7f800000;
    auVar203._0_8_ = 0x7f8000007f800000;
    auVar203._12_4_ = 0x7f800000;
    auVar203._16_4_ = 0x7f800000;
    auVar203._20_4_ = 0x7f800000;
    auVar203._24_4_ = 0x7f800000;
    auVar203._28_4_ = 0x7f800000;
    auVar81 = vblendmps_avx512vl(auVar203,auVar80);
    bVar56 = (byte)uVar134;
    auVar133._0_4_ =
         (uint)(bVar56 & 1) * auVar81._0_4_ | (uint)!(bool)(bVar56 & 1) * (int)auVar80._0_4_;
    bVar67 = (bool)((byte)(uVar134 >> 1) & 1);
    auVar133._4_4_ = (uint)bVar67 * auVar81._4_4_ | (uint)!bVar67 * (int)auVar80._4_4_;
    bVar67 = (bool)((byte)(uVar134 >> 2) & 1);
    auVar133._8_4_ = (uint)bVar67 * auVar81._8_4_ | (uint)!bVar67 * (int)auVar80._8_4_;
    bVar67 = (bool)((byte)(uVar134 >> 3) & 1);
    auVar133._12_4_ = (uint)bVar67 * auVar81._12_4_ | (uint)!bVar67 * (int)auVar80._12_4_;
    bVar67 = (bool)((byte)(uVar134 >> 4) & 1);
    auVar133._16_4_ = (uint)bVar67 * auVar81._16_4_ | (uint)!bVar67 * (int)auVar80._16_4_;
    bVar67 = (bool)((byte)(uVar134 >> 5) & 1);
    auVar133._20_4_ = (uint)bVar67 * auVar81._20_4_ | (uint)!bVar67 * (int)auVar80._20_4_;
    bVar67 = (bool)((byte)(uVar134 >> 6) & 1);
    auVar133._24_4_ = (uint)bVar67 * auVar81._24_4_ | (uint)!bVar67 * (int)auVar80._24_4_;
    auVar133._28_4_ =
         (uVar134 >> 7) * auVar81._28_4_ | (uint)!SUB41(uVar134 >> 7,0) * (int)auVar80._28_4_;
    auVar80 = vshufps_avx(auVar133,auVar133,0xb1);
    auVar80 = vminps_avx(auVar133,auVar80);
    auVar81 = vshufpd_avx(auVar80,auVar80,5);
    auVar80 = vminps_avx(auVar80,auVar81);
    auVar81 = vpermpd_avx2(auVar80,0x4e);
    auVar80 = vminps_avx(auVar80,auVar81);
    uVar16 = vcmpps_avx512vl(auVar133,auVar80,0);
    bVar62 = (byte)uVar16 & bVar56;
    if (bVar62 != 0) {
      uVar134 = (uint)bVar62;
    }
    uVar135 = 0;
    for (; (uVar134 & 1) == 0; uVar134 = uVar134 >> 1 | 0x80000000) {
      uVar135 = uVar135 + 1;
    }
    local_b1c = aiStack_138[uVar60 * 0x18];
    bVar56 = ~('\x01' << ((byte)uVar135 & 0x1f)) & bVar56;
    abStack_180[uVar60 * 0x60] = bVar56;
    if (bVar56 == 0) {
      uVar68 = uVar68 - 1;
    }
    uVar165 = (undefined4)uVar63;
    auVar158._4_4_ = uVar165;
    auVar158._0_4_ = uVar165;
    auVar158._8_4_ = uVar165;
    auVar158._12_4_ = uVar165;
    auVar158._16_4_ = uVar165;
    auVar158._20_4_ = uVar165;
    auVar158._24_4_ = uVar165;
    auVar158._28_4_ = uVar165;
    auVar71 = vmovshdup_avx(auVar176);
    auVar71 = vsubps_avx(auVar71,auVar176);
    auVar180._0_4_ = auVar71._0_4_;
    auVar180._4_4_ = auVar180._0_4_;
    auVar180._8_4_ = auVar180._0_4_;
    auVar180._12_4_ = auVar180._0_4_;
    auVar180._16_4_ = auVar180._0_4_;
    auVar180._20_4_ = auVar180._0_4_;
    auVar180._24_4_ = auVar180._0_4_;
    auVar180._28_4_ = auVar180._0_4_;
    auVar71 = vfmadd132ps_fma(auVar180,auVar158,auVar239._0_32_);
    auVar80 = ZEXT1632(auVar71);
    local_480[0] = (RTCHitN)auVar80[0];
    local_480[1] = (RTCHitN)auVar80[1];
    local_480[2] = (RTCHitN)auVar80[2];
    local_480[3] = (RTCHitN)auVar80[3];
    local_480[4] = (RTCHitN)auVar80[4];
    local_480[5] = (RTCHitN)auVar80[5];
    local_480[6] = (RTCHitN)auVar80[6];
    local_480[7] = (RTCHitN)auVar80[7];
    local_480[8] = (RTCHitN)auVar80[8];
    local_480[9] = (RTCHitN)auVar80[9];
    local_480[10] = (RTCHitN)auVar80[10];
    local_480[0xb] = (RTCHitN)auVar80[0xb];
    local_480[0xc] = (RTCHitN)auVar80[0xc];
    local_480[0xd] = (RTCHitN)auVar80[0xd];
    local_480[0xe] = (RTCHitN)auVar80[0xe];
    local_480[0xf] = (RTCHitN)auVar80[0xf];
    local_480[0x10] = (RTCHitN)auVar80[0x10];
    local_480[0x11] = (RTCHitN)auVar80[0x11];
    local_480[0x12] = (RTCHitN)auVar80[0x12];
    local_480[0x13] = (RTCHitN)auVar80[0x13];
    local_480[0x14] = (RTCHitN)auVar80[0x14];
    local_480[0x15] = (RTCHitN)auVar80[0x15];
    local_480[0x16] = (RTCHitN)auVar80[0x16];
    local_480[0x17] = (RTCHitN)auVar80[0x17];
    local_480[0x18] = (RTCHitN)auVar80[0x18];
    local_480[0x19] = (RTCHitN)auVar80[0x19];
    local_480[0x1a] = (RTCHitN)auVar80[0x1a];
    local_480[0x1b] = (RTCHitN)auVar80[0x1b];
    local_480[0x1c] = (RTCHitN)auVar80[0x1c];
    local_480[0x1d] = (RTCHitN)auVar80[0x1d];
    local_480[0x1e] = (RTCHitN)auVar80[0x1e];
    local_480[0x1f] = (RTCHitN)auVar80[0x1f];
    local_510._8_8_ = 0;
    local_510._0_8_ = *(ulong *)(local_480 + (ulong)uVar135 * 4);
    uVar60 = (ulong)uVar68;
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }